

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersector1<8>::
     intersect_t<embree::avx512::SweepCurve1Intersector1<embree::CatmullRomCurveT>,embree::avx512::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  int iVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [12];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  byte bVar71;
  byte bVar72;
  ulong uVar73;
  byte bVar74;
  byte bVar75;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  ulong uVar76;
  long lVar77;
  bool bVar78;
  ulong uVar79;
  uint uVar80;
  uint uVar131;
  uint uVar132;
  uint uVar134;
  uint uVar135;
  uint uVar136;
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  uint uVar133;
  uint uVar137;
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float pp;
  float fVar138;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar155;
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 auVar154 [64];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  float fVar190;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [64];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [64];
  float fVar214;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  undefined1 auVar217 [32];
  undefined1 auVar223 [16];
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined4 uVar231;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [64];
  float t;
  float fVar235;
  float fVar240;
  undefined1 auVar236 [16];
  float fVar238;
  float fVar239;
  undefined1 auVar237 [64];
  undefined4 uVar242;
  undefined4 uVar243;
  undefined1 auVar241 [32];
  float s;
  undefined1 auVar244 [32];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  float s_1;
  undefined1 auVar247 [16];
  undefined1 auVar248 [32];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [64];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_8bc;
  ulong local_8b8;
  undefined1 local_8b0 [16];
  undefined1 local_8a0 [32];
  undefined1 local_880 [16];
  ulong local_868;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_810 [16];
  undefined1 local_800 [16];
  ulong local_7e8;
  RTCFilterFunctionNArguments local_7e0;
  uint local_7ac;
  uint local_7a8;
  undefined4 local_7a4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [16];
  undefined8 local_750;
  float local_748;
  float local_744;
  undefined4 local_740;
  uint local_73c;
  uint local_738;
  uint local_734;
  uint local_730;
  Primitive *local_718;
  ulong local_710;
  ulong local_708;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [32];
  undefined1 local_640 [16];
  undefined1 local_630 [16];
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  undefined1 local_610 [16];
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined4 local_560;
  undefined4 uStack_55c;
  undefined4 uStack_558;
  undefined4 uStack_554;
  undefined4 uStack_550;
  undefined4 uStack_54c;
  undefined4 uStack_548;
  undefined4 uStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined4 local_320;
  undefined4 uStack_31c;
  undefined4 uStack_318;
  undefined4 uStack_314;
  undefined4 uStack_310;
  undefined4 uStack_30c;
  undefined4 uStack_308;
  undefined4 uStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined4 local_2a0;
  undefined4 uStack_29c;
  undefined4 uStack_298;
  undefined4 uStack_294;
  undefined4 uStack_290;
  undefined4 uStack_28c;
  undefined4 uStack_288;
  undefined4 uStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined4 local_220;
  undefined4 uStack_21c;
  undefined4 uStack_218;
  undefined4 uStack_214;
  undefined4 uStack_210;
  undefined4 uStack_20c;
  undefined4 uStack_208;
  undefined4 uStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined4 local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  byte abStack_180 [32];
  uint auStack_160 [8];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar121 [32];
  undefined1 extraout_var_02 [60];
  
  PVar3 = prim[1];
  uVar76 = (ulong)(byte)PVar3;
  fVar214 = *(float *)(prim + uVar76 * 0x19 + 0x12);
  auVar89 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar76 * 0x19 + 6));
  fVar190 = fVar214 * auVar89._0_4_;
  fVar138 = fVar214 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar76 * 4 + 6);
  auVar96 = vpmovsxbd_avx2(auVar82);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar76 * 5 + 6);
  auVar94 = vpmovsxbd_avx2(auVar83);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar76 * 6 + 6);
  auVar97 = vpmovsxbd_avx2(auVar81);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar76 * 0xb + 6);
  auVar98 = vpmovsxbd_avx2(auVar84);
  auVar236._8_8_ = 0;
  auVar236._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6);
  auVar103 = vpmovsxbd_avx2(auVar236);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar99 = vcvtdq2ps_avx(auVar103);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + (uint)(byte)PVar3 * 0xc + uVar76 + 6);
  auVar95 = vpmovsxbd_avx2(auVar85);
  auVar95 = vcvtdq2ps_avx(auVar95);
  uVar79 = (ulong)(uint)((int)(uVar76 * 9) * 2);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar79 + 6);
  auVar100 = vpmovsxbd_avx2(auVar86);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar79 + uVar76 + 6);
  auVar101 = vpmovsxbd_avx2(auVar87);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar245 = ZEXT3264(auVar101);
  uVar73 = (ulong)(uint)((int)(uVar76 * 5) << 2);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar73 + 6);
  auVar93 = vpmovsxbd_avx2(auVar90);
  auVar102 = vcvtdq2ps_avx(auVar93);
  auVar114._4_4_ = fVar138;
  auVar114._0_4_ = fVar138;
  auVar114._8_4_ = fVar138;
  auVar114._12_4_ = fVar138;
  auVar114._16_4_ = fVar138;
  auVar114._20_4_ = fVar138;
  auVar114._24_4_ = fVar138;
  auVar114._28_4_ = fVar138;
  auVar118._8_4_ = 1;
  auVar118._0_8_ = 0x100000001;
  auVar118._12_4_ = 1;
  auVar118._16_4_ = 1;
  auVar118._20_4_ = 1;
  auVar118._24_4_ = 1;
  auVar118._28_4_ = 1;
  auVar91 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar106 = ZEXT1632(CONCAT412(fVar214 * (ray->super_RayK<1>).dir.field_0.m128[3],
                                CONCAT48(fVar214 * (ray->super_RayK<1>).dir.field_0.m128[2],
                                         CONCAT44(fVar214 * (ray->super_RayK<1>).dir.field_0.m128[1]
                                                  ,fVar138))));
  auVar105 = vpermps_avx2(auVar118,auVar106);
  auVar92 = vpermps_avx512vl(auVar91,auVar106);
  fVar138 = auVar92._0_4_;
  fVar218 = auVar92._4_4_;
  auVar106._4_4_ = fVar218 * auVar97._4_4_;
  auVar106._0_4_ = fVar138 * auVar97._0_4_;
  fVar219 = auVar92._8_4_;
  auVar106._8_4_ = fVar219 * auVar97._8_4_;
  fVar220 = auVar92._12_4_;
  auVar106._12_4_ = fVar220 * auVar97._12_4_;
  fVar222 = auVar92._16_4_;
  auVar106._16_4_ = fVar222 * auVar97._16_4_;
  fVar221 = auVar92._20_4_;
  auVar106._20_4_ = fVar221 * auVar97._20_4_;
  fVar155 = auVar92._24_4_;
  auVar106._24_4_ = fVar155 * auVar97._24_4_;
  auVar106._28_4_ = auVar103._28_4_;
  auVar103._4_4_ = auVar95._4_4_ * fVar218;
  auVar103._0_4_ = auVar95._0_4_ * fVar138;
  auVar103._8_4_ = auVar95._8_4_ * fVar219;
  auVar103._12_4_ = auVar95._12_4_ * fVar220;
  auVar103._16_4_ = auVar95._16_4_ * fVar222;
  auVar103._20_4_ = auVar95._20_4_ * fVar221;
  auVar103._24_4_ = auVar95._24_4_ * fVar155;
  auVar103._28_4_ = auVar93._28_4_;
  auVar93._4_4_ = auVar102._4_4_ * fVar218;
  auVar93._0_4_ = auVar102._0_4_ * fVar138;
  auVar93._8_4_ = auVar102._8_4_ * fVar219;
  auVar93._12_4_ = auVar102._12_4_ * fVar220;
  auVar93._16_4_ = auVar102._16_4_ * fVar222;
  auVar93._20_4_ = auVar102._20_4_ * fVar221;
  auVar93._24_4_ = auVar102._24_4_ * fVar155;
  auVar93._28_4_ = auVar92._28_4_;
  auVar82 = vfmadd231ps_fma(auVar106,auVar105,auVar94);
  auVar83 = vfmadd231ps_fma(auVar103,auVar105,auVar99);
  auVar81 = vfmadd231ps_fma(auVar93,auVar101,auVar105);
  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar114,auVar96);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar114,auVar98);
  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar100,auVar114);
  auVar115._4_4_ = fVar190;
  auVar115._0_4_ = fVar190;
  auVar115._8_4_ = fVar190;
  auVar115._12_4_ = fVar190;
  auVar115._16_4_ = fVar190;
  auVar115._20_4_ = fVar190;
  auVar115._24_4_ = fVar190;
  auVar115._28_4_ = fVar190;
  auVar93 = ZEXT1632(CONCAT412(fVar214 * auVar89._12_4_,
                               CONCAT48(fVar214 * auVar89._8_4_,
                                        CONCAT44(fVar214 * auVar89._4_4_,fVar190))));
  auVar103 = vpermps_avx2(auVar118,auVar93);
  auVar93 = vpermps_avx512vl(auVar91,auVar93);
  fVar214 = auVar93._0_4_;
  fVar138 = auVar93._4_4_;
  auVar105._4_4_ = fVar138 * auVar97._4_4_;
  auVar105._0_4_ = fVar214 * auVar97._0_4_;
  fVar218 = auVar93._8_4_;
  auVar105._8_4_ = fVar218 * auVar97._8_4_;
  fVar219 = auVar93._12_4_;
  auVar105._12_4_ = fVar219 * auVar97._12_4_;
  fVar220 = auVar93._16_4_;
  auVar105._16_4_ = fVar220 * auVar97._16_4_;
  fVar222 = auVar93._20_4_;
  auVar105._20_4_ = fVar222 * auVar97._20_4_;
  fVar221 = auVar93._24_4_;
  auVar105._24_4_ = fVar221 * auVar97._24_4_;
  auVar105._28_4_ = 1;
  auVar91._4_4_ = auVar95._4_4_ * fVar138;
  auVar91._0_4_ = auVar95._0_4_ * fVar214;
  auVar91._8_4_ = auVar95._8_4_ * fVar218;
  auVar91._12_4_ = auVar95._12_4_ * fVar219;
  auVar91._16_4_ = auVar95._16_4_ * fVar220;
  auVar91._20_4_ = auVar95._20_4_ * fVar222;
  auVar91._24_4_ = auVar95._24_4_ * fVar221;
  auVar91._28_4_ = auVar97._28_4_;
  auVar95._4_4_ = auVar102._4_4_ * fVar138;
  auVar95._0_4_ = auVar102._0_4_ * fVar214;
  auVar95._8_4_ = auVar102._8_4_ * fVar218;
  auVar95._12_4_ = auVar102._12_4_ * fVar219;
  auVar95._16_4_ = auVar102._16_4_ * fVar220;
  auVar95._20_4_ = auVar102._20_4_ * fVar222;
  auVar95._24_4_ = auVar102._24_4_ * fVar221;
  auVar95._28_4_ = auVar93._28_4_;
  auVar84 = vfmadd231ps_fma(auVar105,auVar103,auVar94);
  auVar236 = vfmadd231ps_fma(auVar91,auVar103,auVar99);
  auVar85 = vfmadd231ps_fma(auVar95,auVar103,auVar101);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar115,auVar96);
  auVar236 = vfmadd231ps_fma(ZEXT1632(auVar236),auVar115,auVar98);
  auVar111._8_4_ = 0x7fffffff;
  auVar111._0_8_ = 0x7fffffff7fffffff;
  auVar111._12_4_ = 0x7fffffff;
  auVar111._16_4_ = 0x7fffffff;
  auVar111._20_4_ = 0x7fffffff;
  auVar111._24_4_ = 0x7fffffff;
  auVar111._28_4_ = 0x7fffffff;
  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar115,auVar100);
  auVar96 = vandps_avx(ZEXT1632(auVar82),auVar111);
  auVar113._8_4_ = 0x219392ef;
  auVar113._0_8_ = 0x219392ef219392ef;
  auVar113._12_4_ = 0x219392ef;
  auVar113._16_4_ = 0x219392ef;
  auVar113._20_4_ = 0x219392ef;
  auVar113._24_4_ = 0x219392ef;
  auVar113._28_4_ = 0x219392ef;
  uVar79 = vcmpps_avx512vl(auVar96,auVar113,1);
  bVar6 = (bool)((byte)uVar79 & 1);
  auVar92._0_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar82._0_4_;
  bVar6 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar92._4_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar82._4_4_;
  bVar6 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar92._8_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar82._8_4_;
  bVar6 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar92._12_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar82._12_4_;
  auVar92._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * 0x219392ef;
  auVar92._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * 0x219392ef;
  auVar92._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * 0x219392ef;
  auVar92._28_4_ = (uint)(byte)(uVar79 >> 7) * 0x219392ef;
  auVar96 = vandps_avx(ZEXT1632(auVar83),auVar111);
  uVar79 = vcmpps_avx512vl(auVar96,auVar113,1);
  bVar6 = (bool)((byte)uVar79 & 1);
  auVar107._0_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar83._0_4_;
  bVar6 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar107._4_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar83._4_4_;
  bVar6 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar107._8_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar83._8_4_;
  bVar6 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar107._12_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar83._12_4_;
  auVar107._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * 0x219392ef;
  auVar107._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * 0x219392ef;
  auVar107._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * 0x219392ef;
  auVar107._28_4_ = (uint)(byte)(uVar79 >> 7) * 0x219392ef;
  auVar96 = vandps_avx(ZEXT1632(auVar81),auVar111);
  uVar79 = vcmpps_avx512vl(auVar96,auVar113,1);
  bVar6 = (bool)((byte)uVar79 & 1);
  auVar96._0_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar81._0_4_;
  bVar6 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar96._4_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar81._4_4_;
  bVar6 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar96._8_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar81._8_4_;
  bVar6 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar96._12_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar81._12_4_;
  auVar96._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * 0x219392ef;
  auVar96._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * 0x219392ef;
  auVar96._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * 0x219392ef;
  auVar96._28_4_ = (uint)(byte)(uVar79 >> 7) * 0x219392ef;
  auVar94 = vrcp14ps_avx512vl(auVar92);
  auVar112._8_4_ = 0x3f800000;
  auVar112._0_8_ = &DAT_3f8000003f800000;
  auVar112._12_4_ = 0x3f800000;
  auVar112._16_4_ = 0x3f800000;
  auVar112._20_4_ = 0x3f800000;
  auVar112._24_4_ = 0x3f800000;
  auVar112._28_4_ = 0x3f800000;
  auVar82 = vfnmadd213ps_fma(auVar92,auVar94,auVar112);
  auVar82 = vfmadd132ps_fma(ZEXT1632(auVar82),auVar94,auVar94);
  auVar94 = vrcp14ps_avx512vl(auVar107);
  auVar83 = vfnmadd213ps_fma(auVar107,auVar94,auVar112);
  auVar83 = vfmadd132ps_fma(ZEXT1632(auVar83),auVar94,auVar94);
  auVar94 = vrcp14ps_avx512vl(auVar96);
  auVar81 = vfnmadd213ps_fma(auVar96,auVar94,auVar112);
  auVar81 = vfmadd132ps_fma(ZEXT1632(auVar81),auVar94,auVar94);
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 7 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar84));
  auVar100._4_4_ = auVar82._4_4_ * auVar96._4_4_;
  auVar100._0_4_ = auVar82._0_4_ * auVar96._0_4_;
  auVar100._8_4_ = auVar82._8_4_ * auVar96._8_4_;
  auVar100._12_4_ = auVar82._12_4_ * auVar96._12_4_;
  auVar100._16_4_ = auVar96._16_4_ * 0.0;
  auVar100._20_4_ = auVar96._20_4_ * 0.0;
  auVar100._24_4_ = auVar96._24_4_ * 0.0;
  auVar100._28_4_ = auVar96._28_4_;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 9 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar84));
  auVar95 = vpbroadcastd_avx512vl();
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar3 * 0x10 + 6));
  auVar110._0_4_ = auVar82._0_4_ * auVar96._0_4_;
  auVar110._4_4_ = auVar82._4_4_ * auVar96._4_4_;
  auVar110._8_4_ = auVar82._8_4_ * auVar96._8_4_;
  auVar110._12_4_ = auVar82._12_4_ * auVar96._12_4_;
  auVar110._16_4_ = auVar96._16_4_ * 0.0;
  auVar110._20_4_ = auVar96._20_4_ * 0.0;
  auVar110._24_4_ = auVar96._24_4_ * 0.0;
  auVar110._28_4_ = 0;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar3 * 0x10 + uVar76 * -2 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar236));
  auVar101._4_4_ = auVar83._4_4_ * auVar96._4_4_;
  auVar101._0_4_ = auVar83._0_4_ * auVar96._0_4_;
  auVar101._8_4_ = auVar83._8_4_ * auVar96._8_4_;
  auVar101._12_4_ = auVar83._12_4_ * auVar96._12_4_;
  auVar101._16_4_ = auVar96._16_4_ * 0.0;
  auVar101._20_4_ = auVar96._20_4_ * 0.0;
  auVar101._24_4_ = auVar96._24_4_ * 0.0;
  auVar101._28_4_ = auVar96._28_4_;
  auVar96 = vcvtdq2ps_avx(auVar94);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar236));
  auVar109._0_4_ = auVar83._0_4_ * auVar96._0_4_;
  auVar109._4_4_ = auVar83._4_4_ * auVar96._4_4_;
  auVar109._8_4_ = auVar83._8_4_ * auVar96._8_4_;
  auVar109._12_4_ = auVar83._12_4_ * auVar96._12_4_;
  auVar109._16_4_ = auVar96._16_4_ * 0.0;
  auVar109._20_4_ = auVar96._20_4_ * 0.0;
  auVar109._24_4_ = auVar96._24_4_ * 0.0;
  auVar109._28_4_ = 0;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 + uVar76 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar85));
  auVar102._4_4_ = auVar96._4_4_ * auVar81._4_4_;
  auVar102._0_4_ = auVar96._0_4_ * auVar81._0_4_;
  auVar102._8_4_ = auVar96._8_4_ * auVar81._8_4_;
  auVar102._12_4_ = auVar96._12_4_ * auVar81._12_4_;
  auVar102._16_4_ = auVar96._16_4_ * 0.0;
  auVar102._20_4_ = auVar96._20_4_ * 0.0;
  auVar102._24_4_ = auVar96._24_4_ * 0.0;
  auVar102._28_4_ = auVar96._28_4_;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 0x17 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar85));
  auVar108._0_4_ = auVar81._0_4_ * auVar96._0_4_;
  auVar108._4_4_ = auVar81._4_4_ * auVar96._4_4_;
  auVar108._8_4_ = auVar81._8_4_ * auVar96._8_4_;
  auVar108._12_4_ = auVar81._12_4_ * auVar96._12_4_;
  auVar108._16_4_ = auVar96._16_4_ * 0.0;
  auVar108._20_4_ = auVar96._20_4_ * 0.0;
  auVar108._24_4_ = auVar96._24_4_ * 0.0;
  auVar108._28_4_ = 0;
  auVar96 = vpminsd_avx2(auVar100,auVar110);
  auVar94 = vpminsd_avx2(auVar101,auVar109);
  auVar96 = vmaxps_avx(auVar96,auVar94);
  auVar94 = vpminsd_avx2(auVar102,auVar108);
  uVar231 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar97._4_4_ = uVar231;
  auVar97._0_4_ = uVar231;
  auVar97._8_4_ = uVar231;
  auVar97._12_4_ = uVar231;
  auVar97._16_4_ = uVar231;
  auVar97._20_4_ = uVar231;
  auVar97._24_4_ = uVar231;
  auVar97._28_4_ = uVar231;
  auVar94 = vmaxps_avx512vl(auVar94,auVar97);
  auVar96 = vmaxps_avx(auVar96,auVar94);
  auVar94._8_4_ = 0x3f7ffffa;
  auVar94._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar94._12_4_ = 0x3f7ffffa;
  auVar94._16_4_ = 0x3f7ffffa;
  auVar94._20_4_ = 0x3f7ffffa;
  auVar94._24_4_ = 0x3f7ffffa;
  auVar94._28_4_ = 0x3f7ffffa;
  local_3c0 = vmulps_avx512vl(auVar96,auVar94);
  auVar96 = vpmaxsd_avx2(auVar100,auVar110);
  auVar94 = vpmaxsd_avx2(auVar101,auVar109);
  auVar96 = vminps_avx(auVar96,auVar94);
  auVar94 = vpmaxsd_avx2(auVar102,auVar108);
  fVar214 = (ray->super_RayK<1>).tfar;
  auVar98._4_4_ = fVar214;
  auVar98._0_4_ = fVar214;
  auVar98._8_4_ = fVar214;
  auVar98._12_4_ = fVar214;
  auVar98._16_4_ = fVar214;
  auVar98._20_4_ = fVar214;
  auVar98._24_4_ = fVar214;
  auVar98._28_4_ = fVar214;
  auVar94 = vminps_avx512vl(auVar94,auVar98);
  auVar96 = vminps_avx(auVar96,auVar94);
  auVar99._8_4_ = 0x3f800003;
  auVar99._0_8_ = 0x3f8000033f800003;
  auVar99._12_4_ = 0x3f800003;
  auVar99._16_4_ = 0x3f800003;
  auVar99._20_4_ = 0x3f800003;
  auVar99._24_4_ = 0x3f800003;
  auVar99._28_4_ = 0x3f800003;
  auVar96 = vmulps_avx512vl(auVar96,auVar99);
  uVar14 = vpcmpgtd_avx512vl(auVar95,_DAT_0205a920);
  uVar13 = vcmpps_avx512vl(local_3c0,auVar96,2);
  if ((byte)((byte)uVar13 & (byte)uVar14) == 0) {
    return;
  }
  local_708 = (ulong)(byte)((byte)uVar13 & (byte)uVar14);
  auVar246 = ZEXT864(0) << 0x20;
  local_718 = prim;
LAB_01da46c8:
  lVar77 = 0;
  for (uVar79 = local_708; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000) {
    lVar77 = lVar77 + 1;
  }
  local_8b8 = (ulong)*(uint *)(prim + 2);
  pGVar4 = (context->scene->geometries).items[*(uint *)(prim + 2)].ptr;
  local_868 = (ulong)*(uint *)(prim + lVar77 * 4 + 6);
  uVar79 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar77 * 4 + 6));
  p_Var5 = pGVar4[1].intersectionFilterN;
  lVar77 = *(long *)&pGVar4[1].time_range.upper;
  auVar82 = *(undefined1 (*) [16])(lVar77 + (long)p_Var5 * uVar79);
  auVar83 = *(undefined1 (*) [16])(lVar77 + (uVar79 + 1) * (long)p_Var5);
  local_708 = local_708 - 1 & local_708;
  if (local_708 != 0) {
    uVar76 = local_708 - 1 & local_708;
    for (uVar73 = local_708; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
    }
    if (uVar76 != 0) {
      for (; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar88._0_4_ = auVar82._0_4_ + auVar83._0_4_;
  auVar88._4_4_ = auVar82._4_4_ + auVar83._4_4_;
  auVar88._8_4_ = auVar82._8_4_ + auVar83._8_4_;
  auVar88._12_4_ = auVar82._12_4_ + auVar83._12_4_;
  aVar1 = (ray->super_RayK<1>).org.field_0;
  aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar89._8_4_ = 0x3f000000;
  auVar89._0_8_ = 0x3f0000003f000000;
  auVar89._12_4_ = 0x3f000000;
  local_480._16_16_ = auVar96._16_16_;
  auVar81 = vmulps_avx512vl(auVar88,auVar89);
  auVar81 = vsubps_avx(auVar81,(undefined1  [16])aVar1);
  auVar81 = vdpps_avx(auVar81,(undefined1  [16])aVar2,0x7f);
  auVar84 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  auVar232._4_12_ = auVar246._4_12_;
  auVar232._0_4_ = auVar84._0_4_;
  local_480._0_16_ = vrcp14ss_avx512f(auVar246._0_16_,auVar232);
  auVar84 = vfnmadd213ss_fma(local_480._0_16_,auVar84,ZEXT416(0x40000000));
  fVar214 = auVar81._0_4_ * local_480._0_4_ * auVar84._0_4_;
  local_630 = ZEXT416((uint)fVar214);
  auVar223._4_4_ = fVar214;
  auVar223._0_4_ = fVar214;
  auVar223._8_4_ = fVar214;
  auVar223._12_4_ = fVar214;
  fStack_670 = fVar214;
  _local_680 = auVar223;
  fStack_66c = fVar214;
  fStack_668 = fVar214;
  fStack_664 = fVar214;
  auVar81 = vfmadd231ps_fma((undefined1  [16])aVar1,(undefined1  [16])aVar2,auVar223);
  auVar81 = vblendps_avx(auVar81,auVar246._0_16_,8);
  auVar82 = vsubps_avx(auVar82,auVar81);
  uVar231 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
  local_520._4_4_ = uVar231;
  local_520._0_4_ = uVar231;
  local_520._8_4_ = uVar231;
  local_520._12_4_ = uVar231;
  local_520._16_4_ = uVar231;
  local_520._20_4_ = uVar231;
  local_520._24_4_ = uVar231;
  local_520._28_4_ = uVar231;
  auVar234 = ZEXT3264(local_520);
  auVar84 = vsubps_avx(*(undefined1 (*) [16])(lVar77 + (uVar79 + 2) * (long)p_Var5),auVar81);
  uVar231 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
  local_540._4_4_ = uVar231;
  local_540._0_4_ = uVar231;
  local_540._8_4_ = uVar231;
  local_540._12_4_ = uVar231;
  local_540._16_4_ = uVar231;
  local_540._20_4_ = uVar231;
  local_540._24_4_ = uVar231;
  local_540._28_4_ = uVar231;
  auVar237 = ZEXT3264(local_540);
  local_560 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 8);
  uStack_55c = local_560;
  uStack_558 = local_560;
  uStack_554 = local_560;
  uStack_550 = local_560;
  uStack_54c = local_560;
  uStack_548 = local_560;
  uStack_544 = local_560;
  auVar83 = vsubps_avx(auVar83,auVar81);
  auVar81 = vsubps_avx(*(undefined1 (*) [16])(lVar77 + (uVar79 + 3) * (long)p_Var5),auVar81);
  local_1a0 = auVar82._0_4_;
  uStack_19c = local_1a0;
  uStack_198 = local_1a0;
  uStack_194 = local_1a0;
  uStack_190 = local_1a0;
  uStack_18c = local_1a0;
  uStack_188 = local_1a0;
  uStack_184 = local_1a0;
  auVar120._8_4_ = 1;
  auVar120._0_8_ = 0x100000001;
  auVar120._12_4_ = 1;
  auVar120._16_4_ = 1;
  auVar120._20_4_ = 1;
  auVar120._24_4_ = 1;
  auVar120._28_4_ = 1;
  local_6a0 = ZEXT1632(auVar82);
  local_1c0 = vpermps_avx2(auVar120,local_6a0);
  auVar121._8_4_ = 2;
  auVar121._0_8_ = 0x200000002;
  auVar121._12_4_ = 2;
  auVar121._16_4_ = 2;
  auVar121._20_4_ = 2;
  auVar121._24_4_ = 2;
  auVar121._28_4_ = 2;
  local_1e0 = vpermps_avx2(auVar121,local_6a0);
  auVar185._8_4_ = 3;
  auVar185._0_8_ = 0x300000003;
  auVar185._12_4_ = 3;
  auVar185._16_4_ = 3;
  auVar185._20_4_ = 3;
  auVar185._24_4_ = 3;
  auVar185._28_4_ = 3;
  local_200 = vpermps_avx2(auVar185,local_6a0);
  local_220 = auVar83._0_4_;
  uStack_21c = local_220;
  uStack_218 = local_220;
  uStack_214 = local_220;
  uStack_210 = local_220;
  uStack_20c = local_220;
  uStack_208 = local_220;
  uStack_204 = local_220;
  local_6e0 = ZEXT1632(auVar83);
  local_240 = vpermps_avx2(auVar120,local_6e0);
  local_260 = vpermps_avx2(auVar121,local_6e0);
  local_280 = vpermps_avx2(auVar185,local_6e0);
  local_2a0 = auVar84._0_4_;
  uStack_29c = local_2a0;
  uStack_298 = local_2a0;
  uStack_294 = local_2a0;
  uStack_290 = local_2a0;
  uStack_28c = local_2a0;
  uStack_288 = local_2a0;
  uStack_284 = local_2a0;
  local_6c0 = ZEXT1632(auVar84);
  local_2c0 = vpermps_avx2(auVar120,local_6c0);
  local_2e0 = vpermps_avx2(auVar121,local_6c0);
  local_300 = vpermps_avx2(auVar185,local_6c0);
  local_320 = auVar81._0_4_;
  uStack_31c = local_320;
  uStack_318 = local_320;
  uStack_314 = local_320;
  uStack_310 = local_320;
  uStack_30c = local_320;
  uStack_308 = local_320;
  uStack_304 = local_320;
  _local_700 = ZEXT1632(auVar81);
  local_340 = vpermps_avx2(auVar120,_local_700);
  _local_360 = vpermps_avx2(auVar121,_local_700);
  _local_380 = vpermps_avx2(auVar185,_local_700);
  auVar96 = vpermps_avx2(auVar121,ZEXT1632(CONCAT412(aVar2.field_3.w * aVar2.field_3.w,
                                                     CONCAT48(aVar2.z * aVar2.z,
                                                              CONCAT44(aVar2.y * aVar2.y,
                                                                       aVar2.x * aVar2.x)))));
  auVar82 = vfmadd231ps_fma(auVar96,local_540,local_540);
  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),local_520,local_520);
  local_3a0 = ZEXT1632(auVar82);
  auVar119._8_4_ = 0x7fffffff;
  auVar119._0_8_ = 0x7fffffff7fffffff;
  auVar119._12_4_ = 0x7fffffff;
  auVar119._16_4_ = 0x7fffffff;
  auVar119._20_4_ = 0x7fffffff;
  auVar119._24_4_ = 0x7fffffff;
  auVar119._28_4_ = 0x7fffffff;
  vandps_avx512vl(ZEXT1632(auVar82),auVar119);
  local_710 = 1;
  local_7e8 = 0;
  auVar210 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar251 = ZEXT3264(auVar96);
  do {
    auVar82 = vmovshdup_avx(auVar210._0_16_);
    local_7a0._0_4_ = auVar210._0_4_;
    fVar214 = auVar82._0_4_ - local_7a0._0_4_;
    fVar222 = fVar214 * 0.04761905;
    local_760 = auVar210._0_16_;
    local_7a0._4_4_ = local_7a0._0_4_;
    local_7a0._8_4_ = local_7a0._0_4_;
    local_7a0._12_4_ = local_7a0._0_4_;
    local_7a0._16_4_ = local_7a0._0_4_;
    local_7a0._20_4_ = local_7a0._0_4_;
    local_7a0._24_4_ = local_7a0._0_4_;
    local_7a0._28_4_ = local_7a0._0_4_;
    local_840._4_4_ = fVar214;
    local_840._0_4_ = fVar214;
    local_840._8_4_ = fVar214;
    local_840._12_4_ = fVar214;
    local_840._16_4_ = fVar214;
    local_840._20_4_ = fVar214;
    local_840._24_4_ = fVar214;
    local_840._28_4_ = fVar214;
    auVar82 = vfmadd231ps_fma(local_7a0,local_840,_DAT_02020f20);
    auVar96 = vsubps_avx512vl(auVar251._0_32_,ZEXT1632(auVar82));
    auVar94 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar97 = vxorps_avx512vl(ZEXT1632(auVar82),auVar94);
    fVar221 = auVar96._0_4_;
    fVar155 = auVar96._4_4_;
    fVar190 = auVar96._8_4_;
    fVar227 = auVar96._12_4_;
    fVar228 = auVar96._16_4_;
    fVar229 = auVar96._20_4_;
    fVar230 = auVar96._24_4_;
    auVar36._4_4_ = fVar155 * fVar155 * auVar97._4_4_;
    auVar36._0_4_ = fVar221 * fVar221 * auVar97._0_4_;
    auVar36._8_4_ = fVar190 * fVar190 * auVar97._8_4_;
    auVar36._12_4_ = fVar227 * fVar227 * auVar97._12_4_;
    auVar36._16_4_ = fVar228 * fVar228 * auVar97._16_4_;
    auVar36._20_4_ = fVar229 * fVar229 * auVar97._20_4_;
    auVar36._24_4_ = fVar230 * fVar230 * auVar97._24_4_;
    auVar36._28_4_ = auVar97._28_4_;
    fVar138 = auVar82._0_4_;
    fVar218 = auVar82._4_4_;
    fVar219 = auVar82._8_4_;
    fVar220 = auVar82._12_4_;
    auVar210._28_36_ = auVar234._28_36_;
    auVar210._0_28_ =
         ZEXT1628(CONCAT412(fVar220 * fVar220,
                            CONCAT48(fVar219 * fVar219,CONCAT44(fVar218 * fVar218,fVar138 * fVar138)
                                    )));
    fVar235 = fVar138 * 3.0;
    fVar238 = fVar218 * 3.0;
    fVar239 = fVar219 * 3.0;
    fVar240 = fVar220 * 3.0;
    auVar234._28_36_ = auVar237._28_36_;
    auVar234._0_28_ = ZEXT1628(CONCAT412(fVar240,CONCAT48(fVar239,CONCAT44(fVar238,fVar235))));
    auVar172._0_4_ = fVar138 * fVar138 * (fVar235 + -5.0);
    auVar172._4_4_ = fVar218 * fVar218 * (fVar238 + -5.0);
    auVar172._8_4_ = fVar219 * fVar219 * (fVar239 + -5.0);
    auVar172._12_4_ = fVar220 * fVar220 * (fVar240 + -5.0);
    auVar172._16_4_ = 0x80000000;
    auVar172._20_4_ = 0x80000000;
    auVar172._24_4_ = 0x80000000;
    auVar172._28_4_ = 0;
    auVar97 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
    auVar98 = vaddps_avx512vl(auVar172,auVar97);
    auVar251._0_4_ = fVar221 * fVar221;
    auVar251._4_4_ = fVar155 * fVar155;
    auVar251._8_4_ = fVar190 * fVar190;
    auVar251._12_4_ = fVar227 * fVar227;
    auVar251._16_4_ = fVar228 * fVar228;
    auVar251._20_4_ = fVar229 * fVar229;
    auVar251._28_36_ = auVar245._28_36_;
    auVar251._24_4_ = fVar230 * fVar230;
    auVar37._4_4_ = auVar251._4_4_ * (fVar155 * 3.0 + -5.0);
    auVar37._0_4_ = auVar251._0_4_ * (fVar221 * 3.0 + -5.0);
    auVar37._8_4_ = auVar251._8_4_ * (fVar190 * 3.0 + -5.0);
    auVar37._12_4_ = auVar251._12_4_ * (fVar227 * 3.0 + -5.0);
    auVar37._16_4_ = auVar251._16_4_ * (fVar228 * 3.0 + -5.0);
    auVar37._20_4_ = auVar251._20_4_ * (fVar229 * 3.0 + -5.0);
    auVar37._24_4_ = auVar251._24_4_ * (fVar230 * 3.0 + -5.0);
    auVar37._28_4_ = auVar246._28_4_ + -5.0;
    auVar99 = vaddps_avx512vl(auVar37,auVar97);
    auVar94 = vxorps_avx512vl(auVar96,auVar94);
    auVar38._4_4_ = fVar218 * fVar218 * auVar94._4_4_;
    auVar38._0_4_ = fVar138 * fVar138 * auVar94._0_4_;
    auVar38._8_4_ = fVar219 * fVar219 * auVar94._8_4_;
    auVar38._12_4_ = fVar220 * fVar220 * auVar94._12_4_;
    auVar38._16_4_ = auVar94._16_4_ * 0.0 * 0.0;
    auVar38._20_4_ = auVar94._20_4_ * 0.0 * 0.0;
    auVar38._24_4_ = auVar94._24_4_ * 0.0 * 0.0;
    auVar38._28_4_ = auVar94._28_4_;
    auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar94 = vmulps_avx512vl(auVar36,auVar95);
    auVar98 = vmulps_avx512vl(auVar98,auVar95);
    auVar100 = vmulps_avx512vl(auVar99,auVar95);
    auVar101 = vmulps_avx512vl(auVar38,auVar95);
    auVar67._4_4_ = uStack_31c;
    auVar67._0_4_ = local_320;
    auVar67._8_4_ = uStack_318;
    auVar67._12_4_ = uStack_314;
    auVar66._16_4_ = uStack_310;
    auVar66._0_16_ = auVar67;
    auVar66._20_4_ = uStack_30c;
    auVar66._24_4_ = uStack_308;
    auVar66._28_4_ = uStack_304;
    auVar102 = vmulps_avx512vl(auVar66,auVar101);
    auVar103 = vmulps_avx512vl(local_340,auVar101);
    auVar39._4_4_ = (float)local_360._4_4_ * auVar101._4_4_;
    auVar39._0_4_ = (float)local_360._0_4_ * auVar101._0_4_;
    auVar39._8_4_ = fStack_358 * auVar101._8_4_;
    auVar39._12_4_ = fStack_354 * auVar101._12_4_;
    auVar39._16_4_ = fStack_350 * auVar101._16_4_;
    auVar39._20_4_ = fStack_34c * auVar101._20_4_;
    auVar39._24_4_ = fStack_348 * auVar101._24_4_;
    auVar39._28_4_ = auVar99._28_4_;
    auVar40._4_4_ = (float)local_380._4_4_ * auVar101._4_4_;
    auVar40._0_4_ = (float)local_380._0_4_ * auVar101._0_4_;
    auVar40._8_4_ = fStack_378 * auVar101._8_4_;
    auVar40._12_4_ = fStack_374 * auVar101._12_4_;
    auVar40._16_4_ = fStack_370 * auVar101._16_4_;
    auVar40._20_4_ = fStack_36c * auVar101._20_4_;
    auVar40._24_4_ = fStack_368 * auVar101._24_4_;
    auVar40._28_4_ = auVar101._28_4_;
    auVar68._4_4_ = uStack_29c;
    auVar68._0_4_ = local_2a0;
    auVar68._8_4_ = uStack_298;
    auVar68._12_4_ = uStack_294;
    auVar68._16_4_ = uStack_290;
    auVar68._20_4_ = uStack_28c;
    auVar68._24_4_ = uStack_288;
    auVar68._28_4_ = uStack_284;
    auVar99 = vfmadd231ps_avx512vl(auVar102,auVar100,auVar68);
    auVar101 = vfmadd231ps_avx512vl(auVar103,auVar100,local_2c0);
    auVar102 = vfmadd231ps_avx512vl(auVar39,auVar100,local_2e0);
    auVar100 = vfmadd231ps_avx512vl(auVar40,local_300,auVar100);
    auVar69._4_4_ = uStack_21c;
    auVar69._0_4_ = local_220;
    auVar69._8_4_ = uStack_218;
    auVar69._12_4_ = uStack_214;
    auVar69._16_4_ = uStack_210;
    auVar69._20_4_ = uStack_20c;
    auVar69._24_4_ = uStack_208;
    auVar69._28_4_ = uStack_204;
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar98,auVar69);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar98,local_240);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar98,local_260);
    auVar100 = vfmadd231ps_avx512vl(auVar100,local_280,auVar98);
    auVar70._4_4_ = uStack_19c;
    auVar70._0_4_ = local_1a0;
    auVar70._8_4_ = uStack_198;
    auVar70._12_4_ = uStack_194;
    auVar70._16_4_ = uStack_190;
    auVar70._20_4_ = uStack_18c;
    auVar70._24_4_ = uStack_188;
    auVar70._28_4_ = uStack_184;
    local_780 = vfmadd231ps_avx512vl(auVar99,auVar94,auVar70);
    local_660 = vfmadd231ps_avx512vl(auVar101,auVar94,local_1c0);
    local_860 = vfmadd231ps_avx512vl(auVar102,auVar94,local_1e0);
    auVar99 = vfmadd231ps_avx512vl(auVar100,local_200,auVar94);
    fVar214 = auVar96._28_4_;
    auVar41._4_4_ = (fVar155 + fVar155) * fVar218;
    auVar41._0_4_ = (fVar221 + fVar221) * fVar138;
    auVar41._8_4_ = (fVar190 + fVar190) * fVar219;
    auVar41._12_4_ = (fVar227 + fVar227) * fVar220;
    auVar41._16_4_ = (fVar228 + fVar228) * 0.0;
    auVar41._20_4_ = (fVar229 + fVar229) * 0.0;
    auVar41._24_4_ = (fVar230 + fVar230) * 0.0;
    auVar41._28_4_ = auVar98._28_4_;
    auVar96 = vsubps_avx(auVar41,auVar251._0_32_);
    auVar205._0_28_ =
         ZEXT1628(CONCAT412((fVar220 + fVar220) * (fVar240 + -5.0) + fVar240 * fVar220,
                            CONCAT48((fVar219 + fVar219) * (fVar239 + -5.0) + fVar239 * fVar219,
                                     CONCAT44((fVar218 + fVar218) * (fVar238 + -5.0) +
                                              fVar238 * fVar218,
                                              (fVar138 + fVar138) * (fVar235 + -5.0) +
                                              fVar235 * fVar138))));
    auVar205._28_4_ = auVar237._28_4_ + -5.0 + 0.0;
    auVar94 = vaddps_avx512vl(auVar234._0_32_,auVar97);
    auVar42._4_4_ = (fVar155 + fVar155) * auVar94._4_4_;
    auVar42._0_4_ = (fVar221 + fVar221) * auVar94._0_4_;
    auVar42._8_4_ = (fVar190 + fVar190) * auVar94._8_4_;
    auVar42._12_4_ = (fVar227 + fVar227) * auVar94._12_4_;
    auVar42._16_4_ = (fVar228 + fVar228) * auVar94._16_4_;
    auVar42._20_4_ = (fVar229 + fVar229) * auVar94._20_4_;
    auVar42._24_4_ = (fVar230 + fVar230) * auVar94._24_4_;
    auVar42._28_4_ = auVar94._28_4_;
    auVar43._4_4_ = fVar155 * 3.0 * fVar155;
    auVar43._0_4_ = fVar221 * 3.0 * fVar221;
    auVar43._8_4_ = fVar190 * 3.0 * fVar190;
    auVar43._12_4_ = fVar227 * 3.0 * fVar227;
    auVar43._16_4_ = fVar228 * 3.0 * fVar228;
    auVar43._20_4_ = fVar229 * 3.0 * fVar229;
    auVar43._24_4_ = fVar230 * 3.0 * fVar230;
    auVar43._28_4_ = fVar214;
    auVar94 = vsubps_avx(auVar42,auVar43);
    auVar97 = vsubps_avx(auVar210._0_32_,auVar41);
    auVar98 = vmulps_avx512vl(auVar96,auVar95);
    auVar100 = vmulps_avx512vl(auVar205,auVar95);
    auVar94 = vmulps_avx512vl(auVar94,auVar95);
    auVar97 = vmulps_avx512vl(auVar97,auVar95);
    auVar101 = vmulps_avx512vl(auVar66,auVar97);
    auVar102 = vmulps_avx512vl(local_340,auVar97);
    auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar44._4_4_ = auVar97._4_4_ * (float)local_360._4_4_;
    auVar44._0_4_ = auVar97._0_4_ * (float)local_360._0_4_;
    auVar44._8_4_ = auVar97._8_4_ * fStack_358;
    auVar44._12_4_ = auVar97._12_4_ * fStack_354;
    auVar44._16_4_ = auVar97._16_4_ * fStack_350;
    auVar44._20_4_ = auVar97._20_4_ * fStack_34c;
    auVar44._24_4_ = auVar97._24_4_ * fStack_348;
    auVar44._28_4_ = fVar214 + fVar214;
    auVar45._4_4_ = auVar97._4_4_ * (float)local_380._4_4_;
    auVar45._0_4_ = auVar97._0_4_ * (float)local_380._0_4_;
    auVar45._8_4_ = auVar97._8_4_ * fStack_378;
    auVar45._12_4_ = auVar97._12_4_ * fStack_374;
    auVar45._16_4_ = auVar97._16_4_ * fStack_370;
    auVar45._20_4_ = auVar97._20_4_ * fStack_36c;
    auVar45._24_4_ = auVar97._24_4_ * fStack_368;
    auVar45._28_4_ = auVar97._28_4_;
    auVar97 = vfmadd231ps_avx512vl(auVar101,auVar94,auVar68);
    auVar101 = vfmadd231ps_avx512vl(auVar102,auVar94,local_2c0);
    auVar102 = vfmadd231ps_avx512vl(auVar44,auVar94,local_2e0);
    auVar94 = vfmadd231ps_avx512vl(auVar45,local_300,auVar94);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar100,auVar69);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar100,local_240);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar100,local_260);
    auVar94 = vfmadd231ps_avx512vl(auVar94,local_280,auVar100);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar98,auVar70);
    auVar100 = vfmadd231ps_avx512vl(auVar101,auVar98,local_1c0);
    auVar101 = vfmadd231ps_avx512vl(auVar102,auVar98,local_1e0);
    auVar94 = vfmadd231ps_avx512vl(auVar94,local_200,auVar98);
    auVar124._4_4_ = auVar97._4_4_ * fVar222;
    auVar124._0_4_ = auVar97._0_4_ * fVar222;
    auVar124._8_4_ = auVar97._8_4_ * fVar222;
    auVar124._12_4_ = auVar97._12_4_ * fVar222;
    auVar124._16_4_ = auVar97._16_4_ * fVar222;
    auVar124._20_4_ = auVar97._20_4_ * fVar222;
    auVar124._24_4_ = auVar97._24_4_ * fVar222;
    auVar124._28_4_ = auVar96._28_4_;
    auVar46._4_4_ = auVar100._4_4_ * fVar222;
    auVar46._0_4_ = auVar100._0_4_ * fVar222;
    auVar46._8_4_ = auVar100._8_4_ * fVar222;
    auVar46._12_4_ = auVar100._12_4_ * fVar222;
    auVar46._16_4_ = auVar100._16_4_ * fVar222;
    auVar46._20_4_ = auVar100._20_4_ * fVar222;
    auVar46._24_4_ = auVar100._24_4_ * fVar222;
    auVar46._28_4_ = auVar100._28_4_;
    auVar47._4_4_ = auVar101._4_4_ * fVar222;
    auVar47._0_4_ = auVar101._0_4_ * fVar222;
    auVar47._8_4_ = auVar101._8_4_ * fVar222;
    auVar47._12_4_ = auVar101._12_4_ * fVar222;
    auVar47._16_4_ = auVar101._16_4_ * fVar222;
    auVar47._20_4_ = auVar101._20_4_ * fVar222;
    auVar47._24_4_ = auVar101._24_4_ * fVar222;
    auVar47._28_4_ = auVar101._28_4_;
    fVar214 = auVar94._0_4_ * fVar222;
    fVar138 = auVar94._4_4_ * fVar222;
    auVar48._4_4_ = fVar138;
    auVar48._0_4_ = fVar214;
    fVar218 = auVar94._8_4_ * fVar222;
    auVar48._8_4_ = fVar218;
    fVar219 = auVar94._12_4_ * fVar222;
    auVar48._12_4_ = fVar219;
    fVar220 = auVar94._16_4_ * fVar222;
    auVar48._16_4_ = fVar220;
    fVar221 = auVar94._20_4_ * fVar222;
    auVar48._20_4_ = fVar221;
    fVar222 = auVar94._24_4_ * fVar222;
    auVar48._24_4_ = fVar222;
    auVar48._28_4_ = fStack_344;
    auVar82 = vxorps_avx512vl(auVar67,auVar67);
    auVar100 = vpermt2ps_avx512vl(local_780,_DAT_0205fd20,ZEXT1632(auVar82));
    auVar234 = ZEXT3264(auVar100);
    auVar104 = vpermt2ps_avx512vl(local_660,_DAT_0205fd20,ZEXT1632(auVar82));
    auVar97 = ZEXT1632(auVar82);
    auVar101 = vpermt2ps_avx512vl(local_860,_DAT_0205fd20,auVar97);
    auVar206._0_4_ = auVar99._0_4_ + fVar214;
    auVar206._4_4_ = auVar99._4_4_ + fVar138;
    auVar206._8_4_ = auVar99._8_4_ + fVar218;
    auVar206._12_4_ = auVar99._12_4_ + fVar219;
    auVar206._16_4_ = auVar99._16_4_ + fVar220;
    auVar206._20_4_ = auVar99._20_4_ + fVar221;
    auVar206._24_4_ = auVar99._24_4_ + fVar222;
    auVar206._28_4_ = auVar99._28_4_ + fStack_344;
    auVar96 = vmaxps_avx(auVar99,auVar206);
    auVar94 = vminps_avx(auVar99,auVar206);
    auVar102 = vpermt2ps_avx512vl(auVar99,_DAT_0205fd20,auVar97);
    auVar103 = vpermt2ps_avx512vl(auVar124,_DAT_0205fd20,auVar97);
    auVar93 = vpermt2ps_avx512vl(auVar46,_DAT_0205fd20,auVar97);
    auVar114 = ZEXT1632(auVar82);
    auVar105 = vpermt2ps_avx512vl(auVar47,_DAT_0205fd20,auVar114);
    auVar97 = vpermt2ps_avx512vl(auVar48,_DAT_0205fd20,auVar114);
    auVar106 = vsubps_avx512vl(auVar102,auVar97);
    auVar97 = vsubps_avx(auVar100,local_780);
    auVar98 = vsubps_avx(auVar104,local_660);
    auVar99 = vsubps_avx(auVar101,local_860);
    auVar91 = vmulps_avx512vl(auVar98,auVar47);
    auVar91 = vfmsub231ps_avx512vl(auVar91,auVar46,auVar99);
    auVar92 = vmulps_avx512vl(auVar99,auVar124);
    auVar92 = vfmsub231ps_avx512vl(auVar92,auVar47,auVar97);
    auVar107 = vmulps_avx512vl(auVar97,auVar46);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar124,auVar98);
    auVar107 = vmulps_avx512vl(auVar107,auVar107);
    auVar92 = vfmadd231ps_avx512vl(auVar107,auVar92,auVar92);
    auVar91 = vfmadd231ps_avx512vl(auVar92,auVar91,auVar91);
    auVar92 = vmulps_avx512vl(auVar99,auVar99);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar98,auVar98);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar97,auVar97);
    auVar107 = vrcp14ps_avx512vl(auVar92);
    auVar108 = vfnmadd213ps_avx512vl(auVar107,auVar92,auVar95);
    auVar107 = vfmadd132ps_avx512vl(auVar108,auVar107,auVar107);
    auVar91 = vmulps_avx512vl(auVar91,auVar107);
    auVar108 = vmulps_avx512vl(auVar98,auVar105);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar93,auVar99);
    auVar109 = vmulps_avx512vl(auVar99,auVar103);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar105,auVar97);
    auVar110 = vmulps_avx512vl(auVar97,auVar93);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar103,auVar98);
    auVar110 = vmulps_avx512vl(auVar110,auVar110);
    auVar109 = vfmadd231ps_avx512vl(auVar110,auVar109,auVar109);
    auVar108 = vfmadd231ps_avx512vl(auVar109,auVar108,auVar108);
    auVar107 = vmulps_avx512vl(auVar108,auVar107);
    auVar91 = vmaxps_avx512vl(auVar91,auVar107);
    auVar91 = vsqrtps_avx512vl(auVar91);
    auVar107 = vmaxps_avx512vl(auVar106,auVar102);
    auVar96 = vmaxps_avx512vl(auVar96,auVar107);
    auVar107 = vaddps_avx512vl(auVar91,auVar96);
    auVar96 = vminps_avx512vl(auVar106,auVar102);
    auVar96 = vminps_avx(auVar94,auVar96);
    auVar96 = vsubps_avx512vl(auVar96,auVar91);
    auVar21._8_4_ = 0x3f800002;
    auVar21._0_8_ = 0x3f8000023f800002;
    auVar21._12_4_ = 0x3f800002;
    auVar21._16_4_ = 0x3f800002;
    auVar21._20_4_ = 0x3f800002;
    auVar21._24_4_ = 0x3f800002;
    auVar21._28_4_ = 0x3f800002;
    auVar94 = vmulps_avx512vl(auVar107,auVar21);
    auVar22._8_4_ = 0x3f7ffffc;
    auVar22._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar22._12_4_ = 0x3f7ffffc;
    auVar22._16_4_ = 0x3f7ffffc;
    auVar22._20_4_ = 0x3f7ffffc;
    auVar22._24_4_ = 0x3f7ffffc;
    auVar22._28_4_ = 0x3f7ffffc;
    local_8a0 = vmulps_avx512vl(auVar96,auVar22);
    auVar49._4_4_ = auVar94._4_4_ * auVar94._4_4_;
    auVar49._0_4_ = auVar94._0_4_ * auVar94._0_4_;
    auVar49._8_4_ = auVar94._8_4_ * auVar94._8_4_;
    auVar49._12_4_ = auVar94._12_4_ * auVar94._12_4_;
    auVar49._16_4_ = auVar94._16_4_ * auVar94._16_4_;
    auVar49._20_4_ = auVar94._20_4_ * auVar94._20_4_;
    auVar49._24_4_ = auVar94._24_4_ * auVar94._24_4_;
    auVar49._28_4_ = auVar96._28_4_;
    auVar96 = vrsqrt14ps_avx512vl(auVar92);
    auVar23._8_4_ = 0xbf000000;
    auVar23._0_8_ = 0xbf000000bf000000;
    auVar23._12_4_ = 0xbf000000;
    auVar23._16_4_ = 0xbf000000;
    auVar23._20_4_ = 0xbf000000;
    auVar23._24_4_ = 0xbf000000;
    auVar23._28_4_ = 0xbf000000;
    auVar94 = vmulps_avx512vl(auVar92,auVar23);
    auVar50._4_4_ = auVar96._4_4_ * auVar94._4_4_;
    auVar50._0_4_ = auVar96._0_4_ * auVar94._0_4_;
    auVar50._8_4_ = auVar96._8_4_ * auVar94._8_4_;
    auVar50._12_4_ = auVar96._12_4_ * auVar94._12_4_;
    auVar50._16_4_ = auVar96._16_4_ * auVar94._16_4_;
    auVar50._20_4_ = auVar96._20_4_ * auVar94._20_4_;
    auVar50._24_4_ = auVar96._24_4_ * auVar94._24_4_;
    auVar50._28_4_ = auVar94._28_4_;
    auVar94 = vmulps_avx512vl(auVar96,auVar96);
    auVar94 = vmulps_avx512vl(auVar94,auVar50);
    auVar24._8_4_ = 0x3fc00000;
    auVar24._0_8_ = 0x3fc000003fc00000;
    auVar24._12_4_ = 0x3fc00000;
    auVar24._16_4_ = 0x3fc00000;
    auVar24._20_4_ = 0x3fc00000;
    auVar24._24_4_ = 0x3fc00000;
    auVar24._28_4_ = 0x3fc00000;
    auVar102 = vfmadd231ps_avx512vl(auVar94,auVar96,auVar24);
    auVar51._4_4_ = auVar102._4_4_ * auVar97._4_4_;
    auVar51._0_4_ = auVar102._0_4_ * auVar97._0_4_;
    auVar51._8_4_ = auVar102._8_4_ * auVar97._8_4_;
    auVar51._12_4_ = auVar102._12_4_ * auVar97._12_4_;
    auVar51._16_4_ = auVar102._16_4_ * auVar97._16_4_;
    auVar51._20_4_ = auVar102._20_4_ * auVar97._20_4_;
    auVar51._24_4_ = auVar102._24_4_ * auVar97._24_4_;
    auVar51._28_4_ = auVar96._28_4_;
    auVar96 = vmulps_avx512vl(auVar98,auVar102);
    auVar94 = vmulps_avx512vl(auVar99,auVar102);
    auVar106 = vsubps_avx512vl(auVar114,local_780);
    auVar91 = vsubps_avx512vl(auVar114,local_660);
    auVar92 = vsubps_avx512vl(auVar114,local_860);
    auVar61._4_4_ = uStack_55c;
    auVar61._0_4_ = local_560;
    auVar61._8_4_ = uStack_558;
    auVar61._12_4_ = uStack_554;
    auVar61._16_4_ = uStack_550;
    auVar61._20_4_ = uStack_54c;
    auVar61._24_4_ = uStack_548;
    auVar61._28_4_ = uStack_544;
    auVar107 = vmulps_avx512vl(auVar61,auVar92);
    auVar107 = vfmadd231ps_avx512vl(auVar107,local_540,auVar91);
    auVar107 = vfmadd231ps_avx512vl(auVar107,local_520,auVar106);
    auVar108 = vmulps_avx512vl(auVar92,auVar92);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar91,auVar91);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar106,auVar106);
    auVar109 = vmulps_avx512vl(auVar61,auVar94);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar96,local_540);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar51,local_520);
    auVar94 = vmulps_avx512vl(auVar92,auVar94);
    auVar96 = vfmadd231ps_avx512vl(auVar94,auVar91,auVar96);
    auVar110 = vfmadd231ps_avx512vl(auVar96,auVar106,auVar51);
    auVar111 = vmulps_avx512vl(auVar109,auVar109);
    auVar94 = vsubps_avx(local_3a0,auVar111);
    auVar96 = vmulps_avx512vl(auVar109,auVar110);
    auVar96 = vsubps_avx512vl(auVar107,auVar96);
    auVar107 = vaddps_avx512vl(auVar96,auVar96);
    auVar96 = vmulps_avx512vl(auVar110,auVar110);
    auVar108 = vsubps_avx512vl(auVar108,auVar96);
    auVar96 = vsubps_avx(auVar108,auVar49);
    local_5a0 = vmulps_avx512vl(auVar107,auVar107);
    auVar25._8_4_ = 0x40800000;
    auVar25._0_8_ = 0x4080000040800000;
    auVar25._12_4_ = 0x40800000;
    auVar25._16_4_ = 0x40800000;
    auVar25._20_4_ = 0x40800000;
    auVar25._24_4_ = 0x40800000;
    auVar25._28_4_ = 0x40800000;
    auVar112 = vmulps_avx512vl(auVar94,auVar25);
    auVar113 = vmulps_avx512vl(auVar112,auVar96);
    auVar113 = vsubps_avx512vl(local_5a0,auVar113);
    uVar79 = vcmpps_avx512vl(auVar113,auVar114,5);
    bVar71 = (byte)uVar79;
    if (bVar71 == 0) {
      auVar117 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar96 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar116 = auVar96;
    }
    else {
      auVar113 = vsqrtps_avx512vl(auVar113);
      auVar114 = vaddps_avx512vl(auVar94,auVar94);
      auVar115 = vrcp14ps_avx512vl(auVar114);
      auVar95 = vfnmadd213ps_avx512vl(auVar114,auVar115,auVar95);
      auVar95 = vfmadd132ps_avx512vl(auVar95,auVar115,auVar115);
      auVar26._8_4_ = 0x80000000;
      auVar26._0_8_ = 0x8000000080000000;
      auVar26._12_4_ = 0x80000000;
      auVar26._16_4_ = 0x80000000;
      auVar26._20_4_ = 0x80000000;
      auVar26._24_4_ = 0x80000000;
      auVar26._28_4_ = 0x80000000;
      auVar114 = vxorps_avx512vl(auVar107,auVar26);
      auVar114 = vsubps_avx512vl(auVar114,auVar113);
      auVar114 = vmulps_avx512vl(auVar114,auVar95);
      auVar113 = vsubps_avx512vl(auVar113,auVar107);
      auVar95 = vmulps_avx512vl(auVar113,auVar95);
      auVar113 = vfmadd213ps_avx512vl(auVar109,auVar114,auVar110);
      local_4c0 = vmulps_avx512vl(auVar102,auVar113);
      auVar113 = vfmadd213ps_avx512vl(auVar109,auVar95,auVar110);
      local_4e0 = vmulps_avx512vl(auVar102,auVar113);
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar113 = vblendmps_avx512vl(auVar113,auVar114);
      auVar117._0_4_ =
           (uint)(bVar71 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar71 & 1) * local_4e0._0_4_;
      bVar6 = (bool)((byte)(uVar79 >> 1) & 1);
      auVar117._4_4_ = (uint)bVar6 * auVar113._4_4_ | (uint)!bVar6 * local_4e0._4_4_;
      bVar6 = (bool)((byte)(uVar79 >> 2) & 1);
      auVar117._8_4_ = (uint)bVar6 * auVar113._8_4_ | (uint)!bVar6 * local_4e0._8_4_;
      bVar6 = (bool)((byte)(uVar79 >> 3) & 1);
      auVar117._12_4_ = (uint)bVar6 * auVar113._12_4_ | (uint)!bVar6 * local_4e0._12_4_;
      bVar6 = (bool)((byte)(uVar79 >> 4) & 1);
      auVar117._16_4_ = (uint)bVar6 * auVar113._16_4_ | (uint)!bVar6 * local_4e0._16_4_;
      bVar6 = (bool)((byte)(uVar79 >> 5) & 1);
      auVar117._20_4_ = (uint)bVar6 * auVar113._20_4_ | (uint)!bVar6 * local_4e0._20_4_;
      bVar6 = (bool)((byte)(uVar79 >> 6) & 1);
      auVar117._24_4_ = (uint)bVar6 * auVar113._24_4_ | (uint)!bVar6 * local_4e0._24_4_;
      bVar6 = SUB81(uVar79 >> 7,0);
      auVar117._28_4_ = (uint)bVar6 * auVar113._28_4_ | (uint)!bVar6 * local_4e0._28_4_;
      auVar197._8_4_ = 0xff800000;
      auVar197._0_8_ = 0xff800000ff800000;
      auVar197._12_4_ = 0xff800000;
      auVar197._16_4_ = 0xff800000;
      auVar197._20_4_ = 0xff800000;
      auVar197._24_4_ = 0xff800000;
      auVar197._28_4_ = 0xff800000;
      auVar113 = vblendmps_avx512vl(auVar197,auVar95);
      auVar116._0_4_ =
           (uint)(bVar71 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar95._0_4_;
      bVar6 = (bool)((byte)(uVar79 >> 1) & 1);
      auVar116._4_4_ = (uint)bVar6 * auVar113._4_4_ | (uint)!bVar6 * auVar95._4_4_;
      bVar6 = (bool)((byte)(uVar79 >> 2) & 1);
      auVar116._8_4_ = (uint)bVar6 * auVar113._8_4_ | (uint)!bVar6 * auVar95._8_4_;
      bVar6 = (bool)((byte)(uVar79 >> 3) & 1);
      auVar116._12_4_ = (uint)bVar6 * auVar113._12_4_ | (uint)!bVar6 * auVar95._12_4_;
      bVar6 = (bool)((byte)(uVar79 >> 4) & 1);
      auVar116._16_4_ = (uint)bVar6 * auVar113._16_4_ | (uint)!bVar6 * auVar95._16_4_;
      bVar6 = (bool)((byte)(uVar79 >> 5) & 1);
      auVar116._20_4_ = (uint)bVar6 * auVar113._20_4_ | (uint)!bVar6 * auVar95._20_4_;
      bVar6 = (bool)((byte)(uVar79 >> 6) & 1);
      auVar116._24_4_ = (uint)bVar6 * auVar113._24_4_ | (uint)!bVar6 * auVar95._24_4_;
      bVar6 = SUB81(uVar79 >> 7,0);
      auVar116._28_4_ = (uint)bVar6 * auVar113._28_4_ | (uint)!bVar6 * auVar95._28_4_;
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar111,auVar113);
      auVar95 = vmaxps_avx(local_480,auVar113);
      auVar27._8_4_ = 0x36000000;
      auVar27._0_8_ = 0x3600000036000000;
      auVar27._12_4_ = 0x36000000;
      auVar27._16_4_ = 0x36000000;
      auVar27._20_4_ = 0x36000000;
      auVar27._24_4_ = 0x36000000;
      auVar27._28_4_ = 0x36000000;
      auVar95 = vmulps_avx512vl(auVar95,auVar27);
      vandps_avx512vl(auVar94,auVar113);
      uVar73 = vcmpps_avx512vl(auVar95,auVar95,1);
      uVar79 = uVar79 & uVar73;
      bVar75 = (byte)uVar79;
      if (bVar75 != 0) {
        uVar73 = vcmpps_avx512vl(auVar96,_DAT_02020f00,2);
        auVar209._8_4_ = 0xff800000;
        auVar209._0_8_ = 0xff800000ff800000;
        auVar209._12_4_ = 0xff800000;
        auVar209._16_4_ = 0xff800000;
        auVar209._20_4_ = 0xff800000;
        auVar209._24_4_ = 0xff800000;
        auVar209._28_4_ = 0xff800000;
        auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar113 = vblendmps_avx512vl(auVar96,auVar209);
        bVar74 = (byte)uVar73;
        uVar80 = (uint)(bVar74 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar95._0_4_;
        bVar6 = (bool)((byte)(uVar73 >> 1) & 1);
        uVar131 = (uint)bVar6 * auVar113._4_4_ | (uint)!bVar6 * auVar95._4_4_;
        bVar6 = (bool)((byte)(uVar73 >> 2) & 1);
        uVar132 = (uint)bVar6 * auVar113._8_4_ | (uint)!bVar6 * auVar95._8_4_;
        bVar6 = (bool)((byte)(uVar73 >> 3) & 1);
        uVar133 = (uint)bVar6 * auVar113._12_4_ | (uint)!bVar6 * auVar95._12_4_;
        bVar6 = (bool)((byte)(uVar73 >> 4) & 1);
        uVar134 = (uint)bVar6 * auVar113._16_4_ | (uint)!bVar6 * auVar95._16_4_;
        bVar6 = (bool)((byte)(uVar73 >> 5) & 1);
        uVar135 = (uint)bVar6 * auVar113._20_4_ | (uint)!bVar6 * auVar95._20_4_;
        bVar6 = (bool)((byte)(uVar73 >> 6) & 1);
        uVar136 = (uint)bVar6 * auVar113._24_4_ | (uint)!bVar6 * auVar95._24_4_;
        bVar6 = SUB81(uVar73 >> 7,0);
        uVar137 = (uint)bVar6 * auVar113._28_4_ | (uint)!bVar6 * auVar95._28_4_;
        auVar117._0_4_ = (bVar75 & 1) * uVar80 | !(bool)(bVar75 & 1) * auVar117._0_4_;
        bVar6 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar117._4_4_ = bVar6 * uVar131 | !bVar6 * auVar117._4_4_;
        bVar6 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar117._8_4_ = bVar6 * uVar132 | !bVar6 * auVar117._8_4_;
        bVar6 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar117._12_4_ = bVar6 * uVar133 | !bVar6 * auVar117._12_4_;
        bVar6 = (bool)((byte)(uVar79 >> 4) & 1);
        auVar117._16_4_ = bVar6 * uVar134 | !bVar6 * auVar117._16_4_;
        bVar6 = (bool)((byte)(uVar79 >> 5) & 1);
        auVar117._20_4_ = bVar6 * uVar135 | !bVar6 * auVar117._20_4_;
        bVar6 = (bool)((byte)(uVar79 >> 6) & 1);
        auVar117._24_4_ = bVar6 * uVar136 | !bVar6 * auVar117._24_4_;
        bVar6 = SUB81(uVar79 >> 7,0);
        auVar117._28_4_ = bVar6 * uVar137 | !bVar6 * auVar117._28_4_;
        auVar96 = vblendmps_avx512vl(auVar209,auVar96);
        bVar6 = (bool)((byte)(uVar73 >> 1) & 1);
        bVar7 = (bool)((byte)(uVar73 >> 2) & 1);
        bVar8 = (bool)((byte)(uVar73 >> 3) & 1);
        bVar9 = (bool)((byte)(uVar73 >> 4) & 1);
        bVar10 = (bool)((byte)(uVar73 >> 5) & 1);
        bVar11 = (bool)((byte)(uVar73 >> 6) & 1);
        bVar12 = SUB81(uVar73 >> 7,0);
        auVar116._0_4_ =
             (uint)(bVar75 & 1) *
             ((uint)(bVar74 & 1) * auVar96._0_4_ | !(bool)(bVar74 & 1) * uVar80) |
             !(bool)(bVar75 & 1) * auVar116._0_4_;
        bVar78 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar116._4_4_ =
             (uint)bVar78 * ((uint)bVar6 * auVar96._4_4_ | !bVar6 * uVar131) |
             !bVar78 * auVar116._4_4_;
        bVar6 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar116._8_4_ =
             (uint)bVar6 * ((uint)bVar7 * auVar96._8_4_ | !bVar7 * uVar132) |
             !bVar6 * auVar116._8_4_;
        bVar6 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar116._12_4_ =
             (uint)bVar6 * ((uint)bVar8 * auVar96._12_4_ | !bVar8 * uVar133) |
             !bVar6 * auVar116._12_4_;
        bVar6 = (bool)((byte)(uVar79 >> 4) & 1);
        auVar116._16_4_ =
             (uint)bVar6 * ((uint)bVar9 * auVar96._16_4_ | !bVar9 * uVar134) |
             !bVar6 * auVar116._16_4_;
        bVar6 = (bool)((byte)(uVar79 >> 5) & 1);
        auVar116._20_4_ =
             (uint)bVar6 * ((uint)bVar10 * auVar96._20_4_ | !bVar10 * uVar135) |
             !bVar6 * auVar116._20_4_;
        bVar6 = (bool)((byte)(uVar79 >> 6) & 1);
        auVar116._24_4_ =
             (uint)bVar6 * ((uint)bVar11 * auVar96._24_4_ | !bVar11 * uVar136) |
             !bVar6 * auVar116._24_4_;
        bVar6 = SUB81(uVar79 >> 7,0);
        auVar116._28_4_ =
             (uint)bVar6 * ((uint)bVar12 * auVar96._28_4_ | !bVar12 * uVar137) |
             !bVar6 * auVar116._28_4_;
        bVar71 = (~bVar75 | bVar74) & bVar71;
      }
      auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar95 = auVar96;
    }
    if ((bVar71 & 0x7f) == 0) {
LAB_01da53f5:
      auVar251 = ZEXT3264(auVar95);
      auVar245 = ZEXT3264(auVar124);
      auVar237 = ZEXT3264(auVar104);
      auVar246 = ZEXT1664(ZEXT816(0) << 0x40);
    }
    else {
      auVar82 = vsubss_avx512f(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]),local_630);
      auVar198._0_4_ = auVar82._0_4_;
      auVar198._4_4_ = auVar198._0_4_;
      auVar198._8_4_ = auVar198._0_4_;
      auVar198._12_4_ = auVar198._0_4_;
      auVar198._16_4_ = auVar198._0_4_;
      auVar198._20_4_ = auVar198._0_4_;
      auVar198._24_4_ = auVar198._0_4_;
      auVar198._28_4_ = auVar198._0_4_;
      auVar96 = vmaxps_avx512vl(auVar198,auVar117);
      auVar82 = vsubss_avx512f(ZEXT416((uint)(ray->super_RayK<1>).tfar),local_630);
      auVar207._0_4_ = auVar82._0_4_;
      auVar207._4_4_ = auVar207._0_4_;
      auVar207._8_4_ = auVar207._0_4_;
      auVar207._12_4_ = auVar207._0_4_;
      auVar207._16_4_ = auVar207._0_4_;
      auVar207._20_4_ = auVar207._0_4_;
      auVar207._24_4_ = auVar207._0_4_;
      auVar207._28_4_ = auVar207._0_4_;
      auVar113 = vminps_avx512vl(auVar207,auVar116);
      auVar92 = vmulps_avx512vl(auVar92,auVar47);
      auVar91 = vfmadd213ps_avx512vl(auVar91,auVar46,auVar92);
      auVar106 = vfmadd213ps_avx512vl(auVar106,auVar124,auVar91);
      auVar62._4_4_ = uStack_55c;
      auVar62._0_4_ = local_560;
      auVar62._8_4_ = uStack_558;
      auVar62._12_4_ = uStack_554;
      auVar62._16_4_ = uStack_550;
      auVar62._20_4_ = uStack_54c;
      auVar62._24_4_ = uStack_548;
      auVar62._28_4_ = uStack_544;
      auVar91 = vmulps_avx512vl(auVar62,auVar47);
      auVar91 = vfmadd231ps_avx512vl(auVar91,local_540,auVar46);
      auVar91 = vfmadd231ps_avx512vl(auVar91,local_520,auVar124);
      auVar92 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar91,auVar92);
      auVar114 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar13 = vcmpps_avx512vl(auVar92,auVar114,1);
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar106 = vxorps_avx512vl(auVar106,auVar115);
      auVar118 = vrcp14ps_avx512vl(auVar91);
      auVar119 = vxorps_avx512vl(auVar91,auVar115);
      auVar120 = vfnmadd213ps_avx512vl(auVar118,auVar91,auVar95);
      auVar120 = vfmadd132ps_avx512vl(auVar120,auVar118,auVar118);
      auVar106 = vmulps_avx512vl(auVar120,auVar106);
      uVar14 = vcmpps_avx512vl(auVar91,auVar119,1);
      bVar75 = (byte)uVar13 | (byte)uVar14;
      auVar120 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar121 = vblendmps_avx512vl(auVar106,auVar120);
      auVar122._0_4_ =
           (uint)(bVar75 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar118._0_4_;
      bVar6 = (bool)(bVar75 >> 1 & 1);
      auVar122._4_4_ = (uint)bVar6 * auVar121._4_4_ | (uint)!bVar6 * auVar118._4_4_;
      bVar6 = (bool)(bVar75 >> 2 & 1);
      auVar122._8_4_ = (uint)bVar6 * auVar121._8_4_ | (uint)!bVar6 * auVar118._8_4_;
      bVar6 = (bool)(bVar75 >> 3 & 1);
      auVar122._12_4_ = (uint)bVar6 * auVar121._12_4_ | (uint)!bVar6 * auVar118._12_4_;
      bVar6 = (bool)(bVar75 >> 4 & 1);
      auVar122._16_4_ = (uint)bVar6 * auVar121._16_4_ | (uint)!bVar6 * auVar118._16_4_;
      bVar6 = (bool)(bVar75 >> 5 & 1);
      auVar122._20_4_ = (uint)bVar6 * auVar121._20_4_ | (uint)!bVar6 * auVar118._20_4_;
      bVar6 = (bool)(bVar75 >> 6 & 1);
      auVar122._24_4_ = (uint)bVar6 * auVar121._24_4_ | (uint)!bVar6 * auVar118._24_4_;
      auVar122._28_4_ =
           (uint)(bVar75 >> 7) * auVar121._28_4_ | (uint)!(bool)(bVar75 >> 7) * auVar118._28_4_;
      auVar96 = vmaxps_avx(auVar96,auVar122);
      uVar14 = vcmpps_avx512vl(auVar91,auVar119,6);
      bVar75 = (byte)uVar13 | (byte)uVar14;
      auVar118 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar123._0_4_ =
           (uint)(bVar75 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar106._0_4_;
      bVar6 = (bool)(bVar75 >> 1 & 1);
      auVar123._4_4_ = (uint)bVar6 * auVar118._4_4_ | (uint)!bVar6 * auVar106._4_4_;
      bVar6 = (bool)(bVar75 >> 2 & 1);
      auVar123._8_4_ = (uint)bVar6 * auVar118._8_4_ | (uint)!bVar6 * auVar106._8_4_;
      bVar6 = (bool)(bVar75 >> 3 & 1);
      auVar123._12_4_ = (uint)bVar6 * auVar118._12_4_ | (uint)!bVar6 * auVar106._12_4_;
      bVar6 = (bool)(bVar75 >> 4 & 1);
      auVar123._16_4_ = (uint)bVar6 * auVar118._16_4_ | (uint)!bVar6 * auVar106._16_4_;
      bVar6 = (bool)(bVar75 >> 5 & 1);
      auVar123._20_4_ = (uint)bVar6 * auVar118._20_4_ | (uint)!bVar6 * auVar106._20_4_;
      bVar6 = (bool)(bVar75 >> 6 & 1);
      auVar123._24_4_ = (uint)bVar6 * auVar118._24_4_ | (uint)!bVar6 * auVar106._24_4_;
      auVar123._28_4_ =
           (uint)(bVar75 >> 7) * auVar118._28_4_ | (uint)!(bool)(bVar75 >> 7) * auVar106._28_4_;
      auVar106 = vminps_avx(auVar113,auVar123);
      auVar100 = vsubps_avx(ZEXT832(0) << 0x20,auVar100);
      auVar91 = vsubps_avx(ZEXT832(0) << 0x20,auVar104);
      auVar101 = vsubps_avx(ZEXT832(0) << 0x20,auVar101);
      auVar101 = vmulps_avx512vl(auVar101,auVar105);
      auVar101 = vfnmsub231ps_avx512vl(auVar101,auVar93,auVar91);
      auVar100 = vfnmadd231ps_avx512vl(auVar101,auVar103,auVar100);
      auVar101 = vmulps_avx512vl(auVar62,auVar105);
      auVar101 = vfnmsub231ps_avx512vl(auVar101,local_540,auVar93);
      auVar101 = vfnmadd231ps_avx512vl(auVar101,local_520,auVar103);
      vandps_avx512vl(auVar101,auVar92);
      uVar13 = vcmpps_avx512vl(auVar101,auVar114,1);
      auVar100 = vxorps_avx512vl(auVar100,auVar115);
      auVar103 = vrcp14ps_avx512vl(auVar101);
      auVar124 = vxorps_avx512vl(auVar101,auVar115);
      auVar105 = vfnmadd213ps_avx512vl(auVar103,auVar101,auVar95);
      auVar82 = vfmadd132ps_fma(auVar105,auVar103,auVar103);
      fVar214 = auVar82._0_4_ * auVar100._0_4_;
      fVar138 = auVar82._4_4_ * auVar100._4_4_;
      auVar52._4_4_ = fVar138;
      auVar52._0_4_ = fVar214;
      fVar218 = auVar82._8_4_ * auVar100._8_4_;
      auVar52._8_4_ = fVar218;
      fVar219 = auVar82._12_4_ * auVar100._12_4_;
      auVar52._12_4_ = fVar219;
      fVar220 = auVar100._16_4_ * 0.0;
      auVar52._16_4_ = fVar220;
      fVar222 = auVar100._20_4_ * 0.0;
      auVar52._20_4_ = fVar222;
      fVar221 = auVar100._24_4_ * 0.0;
      auVar52._24_4_ = fVar221;
      auVar52._28_4_ = auVar100._28_4_;
      uVar14 = vcmpps_avx512vl(auVar101,auVar124,1);
      bVar75 = (byte)uVar13 | (byte)uVar14;
      auVar105 = vblendmps_avx512vl(auVar52,auVar120);
      auVar125._0_4_ =
           (uint)(bVar75 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar103._0_4_;
      bVar6 = (bool)(bVar75 >> 1 & 1);
      auVar125._4_4_ = (uint)bVar6 * auVar105._4_4_ | (uint)!bVar6 * auVar103._4_4_;
      bVar6 = (bool)(bVar75 >> 2 & 1);
      auVar125._8_4_ = (uint)bVar6 * auVar105._8_4_ | (uint)!bVar6 * auVar103._8_4_;
      bVar6 = (bool)(bVar75 >> 3 & 1);
      auVar125._12_4_ = (uint)bVar6 * auVar105._12_4_ | (uint)!bVar6 * auVar103._12_4_;
      bVar6 = (bool)(bVar75 >> 4 & 1);
      auVar125._16_4_ = (uint)bVar6 * auVar105._16_4_ | (uint)!bVar6 * auVar103._16_4_;
      bVar6 = (bool)(bVar75 >> 5 & 1);
      auVar125._20_4_ = (uint)bVar6 * auVar105._20_4_ | (uint)!bVar6 * auVar103._20_4_;
      bVar6 = (bool)(bVar75 >> 6 & 1);
      auVar125._24_4_ = (uint)bVar6 * auVar105._24_4_ | (uint)!bVar6 * auVar103._24_4_;
      auVar125._28_4_ =
           (uint)(bVar75 >> 7) * auVar105._28_4_ | (uint)!(bool)(bVar75 >> 7) * auVar103._28_4_;
      _local_5c0 = vmaxps_avx(auVar96,auVar125);
      uVar14 = vcmpps_avx512vl(auVar101,auVar124,6);
      bVar75 = (byte)uVar13 | (byte)uVar14;
      auVar104._0_4_ =
           (uint)(bVar75 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar75 & 1) * (int)fVar214;
      bVar6 = (bool)(bVar75 >> 1 & 1);
      auVar104._4_4_ = (uint)bVar6 * auVar118._4_4_ | (uint)!bVar6 * (int)fVar138;
      bVar6 = (bool)(bVar75 >> 2 & 1);
      auVar104._8_4_ = (uint)bVar6 * auVar118._8_4_ | (uint)!bVar6 * (int)fVar218;
      bVar6 = (bool)(bVar75 >> 3 & 1);
      auVar104._12_4_ = (uint)bVar6 * auVar118._12_4_ | (uint)!bVar6 * (int)fVar219;
      bVar6 = (bool)(bVar75 >> 4 & 1);
      auVar104._16_4_ = (uint)bVar6 * auVar118._16_4_ | (uint)!bVar6 * (int)fVar220;
      bVar6 = (bool)(bVar75 >> 5 & 1);
      auVar104._20_4_ = (uint)bVar6 * auVar118._20_4_ | (uint)!bVar6 * (int)fVar222;
      bVar6 = (bool)(bVar75 >> 6 & 1);
      auVar104._24_4_ = (uint)bVar6 * auVar118._24_4_ | (uint)!bVar6 * (int)fVar221;
      auVar104._28_4_ =
           (uint)(bVar75 >> 7) * auVar118._28_4_ | (uint)!(bool)(bVar75 >> 7) * auVar100._28_4_;
      local_400 = vminps_avx(auVar106,auVar104);
      auVar234 = ZEXT3264(local_400);
      auVar100 = _local_5c0;
      uVar13 = vcmpps_avx512vl(_local_5c0,local_400,2);
      bVar71 = bVar71 & 0x7f & (byte)uVar13;
      auVar96 = auVar95;
      if (bVar71 == 0) goto LAB_01da53f5;
      auVar96 = vmaxps_avx(ZEXT832(0) << 0x20,local_8a0);
      auVar101 = vminps_avx512vl(local_4c0,auVar95);
      auVar58 = ZEXT412(0);
      auVar103 = ZEXT1232(auVar58) << 0x20;
      auVar101 = vmaxps_avx(auVar101,ZEXT1232(auVar58) << 0x20);
      auVar105 = vminps_avx512vl(local_4e0,auVar95);
      auVar53._4_4_ = (auVar101._4_4_ + 1.0) * 0.125;
      auVar53._0_4_ = (auVar101._0_4_ + 0.0) * 0.125;
      auVar53._8_4_ = (auVar101._8_4_ + 2.0) * 0.125;
      auVar53._12_4_ = (auVar101._12_4_ + 3.0) * 0.125;
      auVar53._16_4_ = (auVar101._16_4_ + 4.0) * 0.125;
      auVar53._20_4_ = (auVar101._20_4_ + 5.0) * 0.125;
      auVar53._24_4_ = (auVar101._24_4_ + 6.0) * 0.125;
      auVar53._28_4_ = auVar101._28_4_ + 7.0;
      auVar82 = vfmadd213ps_fma(auVar53,local_840,local_7a0);
      local_4c0 = ZEXT1632(auVar82);
      auVar101 = vmaxps_avx(auVar105,ZEXT1232(auVar58) << 0x20);
      auVar54._4_4_ = (auVar101._4_4_ + 1.0) * 0.125;
      auVar54._0_4_ = (auVar101._0_4_ + 0.0) * 0.125;
      auVar54._8_4_ = (auVar101._8_4_ + 2.0) * 0.125;
      auVar54._12_4_ = (auVar101._12_4_ + 3.0) * 0.125;
      auVar54._16_4_ = (auVar101._16_4_ + 4.0) * 0.125;
      auVar54._20_4_ = (auVar101._20_4_ + 5.0) * 0.125;
      auVar54._24_4_ = (auVar101._24_4_ + 6.0) * 0.125;
      auVar54._28_4_ = auVar101._28_4_ + 7.0;
      auVar82 = vfmadd213ps_fma(auVar54,local_840,local_7a0);
      local_4e0 = ZEXT1632(auVar82);
      auVar199._0_4_ = auVar96._0_4_ * auVar96._0_4_;
      auVar199._4_4_ = auVar96._4_4_ * auVar96._4_4_;
      auVar199._8_4_ = auVar96._8_4_ * auVar96._8_4_;
      auVar199._12_4_ = auVar96._12_4_ * auVar96._12_4_;
      auVar199._16_4_ = auVar96._16_4_ * auVar96._16_4_;
      auVar199._20_4_ = auVar96._20_4_ * auVar96._20_4_;
      auVar199._24_4_ = auVar96._24_4_ * auVar96._24_4_;
      auVar199._28_4_ = 0;
      auVar96 = vsubps_avx(auVar108,auVar199);
      auVar101 = vmulps_avx512vl(auVar112,auVar96);
      auVar101 = vsubps_avx(local_5a0,auVar101);
      uVar13 = vcmpps_avx512vl(auVar101,ZEXT1232(auVar58) << 0x20,5);
      bVar75 = (byte)uVar13;
      auVar105 = ZEXT1232(ZEXT812(0)) << 0x20;
      if (bVar75 == 0) {
        auVar97 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar210 = ZEXT864(0) << 0x20;
        auVar95 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar237 = ZEXT864(0) << 0x20;
        auVar126._8_4_ = 0x7f800000;
        auVar126._0_8_ = 0x7f8000007f800000;
        auVar126._12_4_ = 0x7f800000;
        auVar126._16_4_ = 0x7f800000;
        auVar126._20_4_ = 0x7f800000;
        auVar126._24_4_ = 0x7f800000;
        auVar126._28_4_ = 0x7f800000;
        auVar127._8_4_ = 0xff800000;
        auVar127._0_8_ = 0xff800000ff800000;
        auVar127._12_4_ = 0xff800000;
        auVar127._16_4_ = 0xff800000;
        auVar127._20_4_ = 0xff800000;
        auVar127._24_4_ = 0xff800000;
        auVar127._28_4_ = 0xff800000;
      }
      else {
        auVar83 = vxorps_avx512vl(auVar93._0_16_,auVar93._0_16_);
        uVar79 = vcmpps_avx512vl(auVar101,ZEXT1232(ZEXT812(0)) << 0x20,5);
        auVar101 = vsqrtps_avx(auVar101);
        auVar208._0_4_ = auVar94._0_4_ + auVar94._0_4_;
        auVar208._4_4_ = auVar94._4_4_ + auVar94._4_4_;
        auVar208._8_4_ = auVar94._8_4_ + auVar94._8_4_;
        auVar208._12_4_ = auVar94._12_4_ + auVar94._12_4_;
        auVar208._16_4_ = auVar94._16_4_ + auVar94._16_4_;
        auVar208._20_4_ = auVar94._20_4_ + auVar94._20_4_;
        auVar208._24_4_ = auVar94._24_4_ + auVar94._24_4_;
        auVar208._28_4_ = auVar94._28_4_ + auVar94._28_4_;
        auVar103 = vrcp14ps_avx512vl(auVar208);
        auVar95 = vfnmadd213ps_avx512vl(auVar208,auVar103,auVar95);
        auVar82 = vfmadd132ps_fma(auVar95,auVar103,auVar103);
        auVar28._8_4_ = 0x80000000;
        auVar28._0_8_ = 0x8000000080000000;
        auVar28._12_4_ = 0x80000000;
        auVar28._16_4_ = 0x80000000;
        auVar28._20_4_ = 0x80000000;
        auVar28._24_4_ = 0x80000000;
        auVar28._28_4_ = 0x80000000;
        auVar95 = vxorps_avx512vl(auVar107,auVar28);
        auVar95 = vsubps_avx(auVar95,auVar101);
        auVar55._4_4_ = auVar95._4_4_ * auVar82._4_4_;
        auVar55._0_4_ = auVar95._0_4_ * auVar82._0_4_;
        auVar55._8_4_ = auVar95._8_4_ * auVar82._8_4_;
        auVar55._12_4_ = auVar95._12_4_ * auVar82._12_4_;
        auVar55._16_4_ = auVar95._16_4_ * 0.0;
        auVar55._20_4_ = auVar95._20_4_ * 0.0;
        auVar55._24_4_ = auVar95._24_4_ * 0.0;
        auVar55._28_4_ = 0x3e000000;
        auVar101 = vsubps_avx512vl(auVar101,auVar107);
        auVar248._0_4_ = auVar101._0_4_ * auVar82._0_4_;
        auVar248._4_4_ = auVar101._4_4_ * auVar82._4_4_;
        auVar248._8_4_ = auVar101._8_4_ * auVar82._8_4_;
        auVar248._12_4_ = auVar101._12_4_ * auVar82._12_4_;
        auVar248._16_4_ = auVar101._16_4_ * 0.0;
        auVar248._20_4_ = auVar101._20_4_ * 0.0;
        auVar248._24_4_ = auVar101._24_4_ * 0.0;
        auVar248._28_4_ = 0;
        auVar101 = vfmadd213ps_avx512vl(auVar109,auVar55,auVar110);
        auVar56._4_4_ = auVar102._4_4_ * auVar101._4_4_;
        auVar56._0_4_ = auVar102._0_4_ * auVar101._0_4_;
        auVar56._8_4_ = auVar102._8_4_ * auVar101._8_4_;
        auVar56._12_4_ = auVar102._12_4_ * auVar101._12_4_;
        auVar56._16_4_ = auVar102._16_4_ * auVar101._16_4_;
        auVar56._20_4_ = auVar102._20_4_ * auVar101._20_4_;
        auVar56._24_4_ = auVar102._24_4_ * auVar101._24_4_;
        auVar56._28_4_ = auVar95._28_4_;
        auVar95 = vmulps_avx512vl(local_520,auVar55);
        auVar101 = vmulps_avx512vl(local_540,auVar55);
        auVar63._4_4_ = uStack_55c;
        auVar63._0_4_ = local_560;
        auVar63._8_4_ = uStack_558;
        auVar63._12_4_ = uStack_554;
        auVar63._16_4_ = uStack_550;
        auVar63._20_4_ = uStack_54c;
        auVar63._24_4_ = uStack_548;
        auVar63._28_4_ = uStack_544;
        auVar103 = vmulps_avx512vl(auVar63,auVar55);
        auVar93 = vfmadd213ps_avx512vl(auVar97,auVar56,local_780);
        auVar95 = vsubps_avx512vl(auVar95,auVar93);
        auVar93 = vfmadd213ps_avx512vl(auVar98,auVar56,local_660);
        auVar105 = vsubps_avx512vl(auVar101,auVar93);
        auVar82 = vfmadd213ps_fma(auVar56,auVar99,local_860);
        auVar101 = vsubps_avx(auVar103,ZEXT1632(auVar82));
        auVar237 = ZEXT3264(auVar101);
        auVar101 = vfmadd213ps_avx512vl(auVar109,auVar248,auVar110);
        auVar101 = vmulps_avx512vl(auVar102,auVar101);
        auVar102 = vmulps_avx512vl(local_520,auVar248);
        auVar93 = vmulps_avx512vl(local_540,auVar248);
        auVar106 = vmulps_avx512vl(auVar63,auVar248);
        auVar82 = vfmadd213ps_fma(auVar97,auVar101,local_780);
        auVar103 = vsubps_avx(auVar102,ZEXT1632(auVar82));
        auVar82 = vfmadd213ps_fma(auVar98,auVar101,local_660);
        auVar97 = vsubps_avx512vl(auVar93,ZEXT1632(auVar82));
        auVar82 = vfmadd213ps_fma(auVar99,auVar101,local_860);
        auVar98 = vsubps_avx512vl(auVar106,ZEXT1632(auVar82));
        auVar210 = ZEXT3264(auVar98);
        auVar145._8_4_ = 0x7f800000;
        auVar145._0_8_ = 0x7f8000007f800000;
        auVar145._12_4_ = 0x7f800000;
        auVar145._16_4_ = 0x7f800000;
        auVar145._20_4_ = 0x7f800000;
        auVar145._24_4_ = 0x7f800000;
        auVar145._28_4_ = 0x7f800000;
        auVar98 = vblendmps_avx512vl(auVar145,auVar55);
        bVar6 = (bool)((byte)uVar79 & 1);
        auVar126._0_4_ = (uint)bVar6 * auVar98._0_4_ | (uint)!bVar6 * local_780._0_4_;
        bVar6 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar126._4_4_ = (uint)bVar6 * auVar98._4_4_ | (uint)!bVar6 * local_780._4_4_;
        bVar6 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar126._8_4_ = (uint)bVar6 * auVar98._8_4_ | (uint)!bVar6 * local_780._8_4_;
        bVar6 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar126._12_4_ = (uint)bVar6 * auVar98._12_4_ | (uint)!bVar6 * local_780._12_4_;
        bVar6 = (bool)((byte)(uVar79 >> 4) & 1);
        auVar126._16_4_ = (uint)bVar6 * auVar98._16_4_ | (uint)!bVar6 * local_780._16_4_;
        bVar6 = (bool)((byte)(uVar79 >> 5) & 1);
        auVar126._20_4_ = (uint)bVar6 * auVar98._20_4_ | (uint)!bVar6 * local_780._20_4_;
        bVar6 = (bool)((byte)(uVar79 >> 6) & 1);
        auVar126._24_4_ = (uint)bVar6 * auVar98._24_4_ | (uint)!bVar6 * local_780._24_4_;
        bVar6 = SUB81(uVar79 >> 7,0);
        auVar126._28_4_ = (uint)bVar6 * auVar98._28_4_ | (uint)!bVar6 * local_780._28_4_;
        auVar146._8_4_ = 0xff800000;
        auVar146._0_8_ = 0xff800000ff800000;
        auVar146._12_4_ = 0xff800000;
        auVar146._16_4_ = 0xff800000;
        auVar146._20_4_ = 0xff800000;
        auVar146._24_4_ = 0xff800000;
        auVar146._28_4_ = 0xff800000;
        auVar98 = vblendmps_avx512vl(auVar146,auVar248);
        bVar6 = (bool)((byte)uVar79 & 1);
        auVar127._0_4_ = (uint)bVar6 * auVar98._0_4_ | (uint)!bVar6 * -0x800000;
        bVar6 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar127._4_4_ = (uint)bVar6 * auVar98._4_4_ | (uint)!bVar6 * -0x800000;
        bVar6 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar127._8_4_ = (uint)bVar6 * auVar98._8_4_ | (uint)!bVar6 * -0x800000;
        bVar6 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar127._12_4_ = (uint)bVar6 * auVar98._12_4_ | (uint)!bVar6 * -0x800000;
        bVar6 = (bool)((byte)(uVar79 >> 4) & 1);
        auVar127._16_4_ = (uint)bVar6 * auVar98._16_4_ | (uint)!bVar6 * -0x800000;
        bVar6 = (bool)((byte)(uVar79 >> 5) & 1);
        auVar127._20_4_ = (uint)bVar6 * auVar98._20_4_ | (uint)!bVar6 * -0x800000;
        bVar6 = (bool)((byte)(uVar79 >> 6) & 1);
        auVar127._24_4_ = (uint)bVar6 * auVar98._24_4_ | (uint)!bVar6 * -0x800000;
        bVar6 = SUB81(uVar79 >> 7,0);
        auVar127._28_4_ = (uint)bVar6 * auVar98._28_4_ | (uint)!bVar6 * -0x800000;
        auVar224._8_4_ = 0x7fffffff;
        auVar224._0_8_ = 0x7fffffff7fffffff;
        auVar224._12_4_ = 0x7fffffff;
        auVar224._16_4_ = 0x7fffffff;
        auVar224._20_4_ = 0x7fffffff;
        auVar224._24_4_ = 0x7fffffff;
        auVar224._28_4_ = 0x7fffffff;
        vandps_avx512vl(auVar111,auVar224);
        auVar98 = vmaxps_avx(local_480,auVar127);
        auVar29._8_4_ = 0x36000000;
        auVar29._0_8_ = 0x3600000036000000;
        auVar29._12_4_ = 0x36000000;
        auVar29._16_4_ = 0x36000000;
        auVar29._20_4_ = 0x36000000;
        auVar29._24_4_ = 0x36000000;
        auVar29._28_4_ = 0x36000000;
        auVar98 = vmulps_avx512vl(auVar98,auVar29);
        auVar94 = vandps_avx(auVar94,auVar224);
        uVar73 = vcmpps_avx512vl(auVar94,auVar98,1);
        uVar79 = uVar79 & uVar73;
        bVar74 = (byte)uVar79;
        if (bVar74 != 0) {
          uVar73 = vcmpps_avx512vl(auVar96,ZEXT1632(auVar83),2);
          auVar225._8_4_ = 0xff800000;
          auVar225._0_8_ = 0xff800000ff800000;
          auVar225._12_4_ = 0xff800000;
          auVar225._16_4_ = 0xff800000;
          auVar225._20_4_ = 0xff800000;
          auVar225._24_4_ = 0xff800000;
          auVar225._28_4_ = 0xff800000;
          auVar244._8_4_ = 0x7f800000;
          auVar244._0_8_ = 0x7f8000007f800000;
          auVar244._12_4_ = 0x7f800000;
          auVar244._16_4_ = 0x7f800000;
          auVar244._20_4_ = 0x7f800000;
          auVar244._24_4_ = 0x7f800000;
          auVar244._28_4_ = 0x7f800000;
          auVar96 = vblendmps_avx512vl(auVar244,auVar225);
          bVar72 = (byte)uVar73;
          uVar80 = (uint)(bVar72 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar98._0_4_;
          bVar6 = (bool)((byte)(uVar73 >> 1) & 1);
          uVar131 = (uint)bVar6 * auVar96._4_4_ | (uint)!bVar6 * auVar98._4_4_;
          bVar6 = (bool)((byte)(uVar73 >> 2) & 1);
          uVar132 = (uint)bVar6 * auVar96._8_4_ | (uint)!bVar6 * auVar98._8_4_;
          bVar6 = (bool)((byte)(uVar73 >> 3) & 1);
          uVar133 = (uint)bVar6 * auVar96._12_4_ | (uint)!bVar6 * auVar98._12_4_;
          bVar6 = (bool)((byte)(uVar73 >> 4) & 1);
          uVar134 = (uint)bVar6 * auVar96._16_4_ | (uint)!bVar6 * auVar98._16_4_;
          bVar6 = (bool)((byte)(uVar73 >> 5) & 1);
          uVar135 = (uint)bVar6 * auVar96._20_4_ | (uint)!bVar6 * auVar98._20_4_;
          bVar6 = (bool)((byte)(uVar73 >> 6) & 1);
          uVar136 = (uint)bVar6 * auVar96._24_4_ | (uint)!bVar6 * auVar98._24_4_;
          bVar6 = SUB81(uVar73 >> 7,0);
          uVar137 = (uint)bVar6 * auVar96._28_4_ | (uint)!bVar6 * auVar98._28_4_;
          auVar126._0_4_ = (bVar74 & 1) * uVar80 | !(bool)(bVar74 & 1) * auVar126._0_4_;
          bVar6 = (bool)((byte)(uVar79 >> 1) & 1);
          auVar126._4_4_ = bVar6 * uVar131 | !bVar6 * auVar126._4_4_;
          bVar6 = (bool)((byte)(uVar79 >> 2) & 1);
          auVar126._8_4_ = bVar6 * uVar132 | !bVar6 * auVar126._8_4_;
          bVar6 = (bool)((byte)(uVar79 >> 3) & 1);
          auVar126._12_4_ = bVar6 * uVar133 | !bVar6 * auVar126._12_4_;
          bVar6 = (bool)((byte)(uVar79 >> 4) & 1);
          auVar126._16_4_ = bVar6 * uVar134 | !bVar6 * auVar126._16_4_;
          bVar6 = (bool)((byte)(uVar79 >> 5) & 1);
          auVar126._20_4_ = bVar6 * uVar135 | !bVar6 * auVar126._20_4_;
          bVar6 = (bool)((byte)(uVar79 >> 6) & 1);
          auVar126._24_4_ = bVar6 * uVar136 | !bVar6 * auVar126._24_4_;
          bVar6 = SUB81(uVar79 >> 7,0);
          auVar126._28_4_ = bVar6 * uVar137 | !bVar6 * auVar126._28_4_;
          auVar96 = vblendmps_avx512vl(auVar225,auVar244);
          bVar6 = (bool)((byte)(uVar73 >> 1) & 1);
          bVar7 = (bool)((byte)(uVar73 >> 2) & 1);
          bVar8 = (bool)((byte)(uVar73 >> 3) & 1);
          bVar9 = (bool)((byte)(uVar73 >> 4) & 1);
          bVar10 = (bool)((byte)(uVar73 >> 5) & 1);
          bVar11 = (bool)((byte)(uVar73 >> 6) & 1);
          bVar12 = SUB81(uVar73 >> 7,0);
          auVar127._0_4_ =
               (uint)(bVar74 & 1) *
               ((uint)(bVar72 & 1) * auVar96._0_4_ | !(bool)(bVar72 & 1) * uVar80) |
               !(bool)(bVar74 & 1) * auVar127._0_4_;
          bVar78 = (bool)((byte)(uVar79 >> 1) & 1);
          auVar127._4_4_ =
               (uint)bVar78 * ((uint)bVar6 * auVar96._4_4_ | !bVar6 * uVar131) |
               !bVar78 * auVar127._4_4_;
          bVar6 = (bool)((byte)(uVar79 >> 2) & 1);
          auVar127._8_4_ =
               (uint)bVar6 * ((uint)bVar7 * auVar96._8_4_ | !bVar7 * uVar132) |
               !bVar6 * auVar127._8_4_;
          bVar6 = (bool)((byte)(uVar79 >> 3) & 1);
          auVar127._12_4_ =
               (uint)bVar6 * ((uint)bVar8 * auVar96._12_4_ | !bVar8 * uVar133) |
               !bVar6 * auVar127._12_4_;
          bVar6 = (bool)((byte)(uVar79 >> 4) & 1);
          auVar127._16_4_ =
               (uint)bVar6 * ((uint)bVar9 * auVar96._16_4_ | !bVar9 * uVar134) |
               !bVar6 * auVar127._16_4_;
          bVar6 = (bool)((byte)(uVar79 >> 5) & 1);
          auVar127._20_4_ =
               (uint)bVar6 * ((uint)bVar10 * auVar96._20_4_ | !bVar10 * uVar135) |
               !bVar6 * auVar127._20_4_;
          bVar6 = (bool)((byte)(uVar79 >> 6) & 1);
          auVar127._24_4_ =
               (uint)bVar6 * ((uint)bVar11 * auVar96._24_4_ | !bVar11 * uVar136) |
               !bVar6 * auVar127._24_4_;
          bVar6 = SUB81(uVar79 >> 7,0);
          auVar127._28_4_ =
               (uint)bVar6 * ((uint)bVar12 * auVar96._28_4_ | !bVar12 * uVar137) |
               !bVar6 * auVar127._28_4_;
          bVar75 = (~bVar74 | bVar72) & bVar75;
        }
      }
      auVar246 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar247._8_4_ = 0x7fffffff;
      auVar247._0_8_ = 0x7fffffff7fffffff;
      auVar247._12_4_ = 0x7fffffff;
      uVar231 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
      auVar217._4_4_ = uVar231;
      auVar217._0_4_ = uVar231;
      auVar217._8_4_ = uVar231;
      auVar217._12_4_ = uVar231;
      auVar217._16_4_ = uVar231;
      auVar217._20_4_ = uVar231;
      auVar217._24_4_ = uVar231;
      auVar217._28_4_ = uVar231;
      uVar231 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
      auVar226._4_4_ = uVar231;
      auVar226._0_4_ = uVar231;
      auVar226._8_4_ = uVar231;
      auVar226._12_4_ = uVar231;
      auVar226._16_4_ = uVar231;
      auVar226._20_4_ = uVar231;
      auVar226._24_4_ = uVar231;
      auVar226._28_4_ = uVar231;
      fVar214 = (ray->super_RayK<1>).dir.field_0.m128[2];
      auVar245 = ZEXT3264(CONCAT428(fVar214,CONCAT424(fVar214,CONCAT420(fVar214,CONCAT416(fVar214,
                                                  CONCAT412(fVar214,CONCAT48(fVar214,CONCAT44(
                                                  fVar214,fVar214))))))));
      auVar213._0_4_ = fVar214 * auVar210._0_4_;
      auVar213._4_4_ = fVar214 * auVar210._4_4_;
      auVar213._8_4_ = fVar214 * auVar210._8_4_;
      auVar213._12_4_ = fVar214 * auVar210._12_4_;
      auVar213._16_4_ = fVar214 * auVar210._16_4_;
      auVar213._20_4_ = fVar214 * auVar210._20_4_;
      auVar213._28_36_ = auVar210._28_36_;
      auVar213._24_4_ = fVar214 * auVar210._24_4_;
      auVar82 = vfmadd231ps_fma(auVar213._0_32_,auVar226,auVar97);
      auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar217,auVar103);
      _local_460 = _local_5c0;
      local_440 = vminps_avx(local_400,auVar126);
      auVar241._8_4_ = 0x7fffffff;
      auVar241._0_8_ = 0x7fffffff7fffffff;
      auVar241._12_4_ = 0x7fffffff;
      auVar241._16_4_ = 0x7fffffff;
      auVar241._20_4_ = 0x7fffffff;
      auVar241._24_4_ = 0x7fffffff;
      auVar241._28_4_ = 0x7fffffff;
      auVar96 = vandps_avx(auVar241,ZEXT1632(auVar82));
      _local_420 = vmaxps_avx(_local_5c0,auVar127);
      auVar148._8_4_ = 0x3e99999a;
      auVar148._0_8_ = 0x3e99999a3e99999a;
      auVar148._12_4_ = 0x3e99999a;
      auVar148._16_4_ = 0x3e99999a;
      auVar148._20_4_ = 0x3e99999a;
      auVar148._24_4_ = 0x3e99999a;
      auVar148._28_4_ = 0x3e99999a;
      uVar13 = vcmpps_avx512vl(auVar96,auVar148,1);
      local_7a4 = (int)uVar13;
      uVar13 = vcmpps_avx512vl(_local_5c0,local_440,2);
      bVar74 = (byte)uVar13 & bVar71;
      _local_580 = _local_420;
      uVar14 = vcmpps_avx512vl(_local_420,local_400,2);
      if ((bVar71 & ((byte)uVar14 | (byte)uVar13)) == 0) {
        auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar251 = ZEXT3264(auVar96);
      }
      else {
        auVar57._4_4_ = auVar237._4_4_ * fVar214;
        auVar57._0_4_ = auVar237._0_4_ * fVar214;
        auVar57._8_4_ = auVar237._8_4_ * fVar214;
        auVar57._12_4_ = auVar237._12_4_ * fVar214;
        auVar57._16_4_ = auVar237._16_4_ * fVar214;
        auVar57._20_4_ = auVar237._20_4_ * fVar214;
        auVar57._24_4_ = auVar237._24_4_ * fVar214;
        auVar57._28_4_ = 0x3e99999a;
        auVar82 = vfmadd213ps_fma(auVar105,auVar226,auVar57);
        auVar82 = vfmadd213ps_fma(auVar95,auVar217,ZEXT1632(auVar82));
        auVar96 = vandps_avx(auVar241,ZEXT1632(auVar82));
        uVar13 = vcmpps_avx512vl(auVar96,auVar148,1);
        local_7ac = (uint)(byte)~bVar75;
        bVar75 = (byte)uVar13 | ~bVar75;
        auVar149._8_4_ = 2;
        auVar149._0_8_ = 0x200000002;
        auVar149._12_4_ = 2;
        auVar149._16_4_ = 2;
        auVar149._20_4_ = 2;
        auVar149._24_4_ = 2;
        auVar149._28_4_ = 2;
        auVar30._8_4_ = 3;
        auVar30._0_8_ = 0x300000003;
        auVar30._12_4_ = 3;
        auVar30._16_4_ = 3;
        auVar30._20_4_ = 3;
        auVar30._24_4_ = 3;
        auVar30._28_4_ = 3;
        auVar96 = vpblendmd_avx512vl(auVar149,auVar30);
        local_3e0._0_4_ = (uint)(bVar75 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar75 & 1) * 2;
        bVar6 = (bool)(bVar75 >> 1 & 1);
        local_3e0._4_4_ = (uint)bVar6 * auVar96._4_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar75 >> 2 & 1);
        local_3e0._8_4_ = (uint)bVar6 * auVar96._8_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar75 >> 3 & 1);
        local_3e0._12_4_ = (uint)bVar6 * auVar96._12_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar75 >> 4 & 1);
        local_3e0._16_4_ = (uint)bVar6 * auVar96._16_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar75 >> 5 & 1);
        local_3e0._20_4_ = (uint)bVar6 * auVar96._20_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar75 >> 6 & 1);
        local_3e0._24_4_ = (uint)bVar6 * auVar96._24_4_ | (uint)!bVar6 * 2;
        local_3e0._28_4_ = (uint)(bVar75 >> 7) * auVar96._28_4_ | (uint)!(bool)(bVar75 >> 7) * 2;
        local_4a0 = vpbroadcastd_avx512vl();
        uVar13 = vpcmpd_avx512vl(local_4a0,local_3e0,5);
        local_7a8 = (uint)bVar74;
        bVar74 = (byte)uVar13 & bVar74;
        if (bVar74 != 0) {
          auVar83 = vminps_avx(local_6a0._0_16_,local_6e0._0_16_);
          auVar82 = vmaxps_avx(local_6a0._0_16_,local_6e0._0_16_);
          auVar81 = vminps_avx(local_6c0._0_16_,local_700._0_16_);
          auVar84 = vminps_avx(auVar83,auVar81);
          auVar83 = vmaxps_avx(local_6c0._0_16_,local_700._0_16_);
          auVar81 = vmaxps_avx(auVar82,auVar83);
          auVar82 = vandps_avx(auVar247,auVar84);
          auVar83 = vandps_avx(auVar247,auVar81);
          auVar82 = vmaxps_avx(auVar82,auVar83);
          auVar83 = vmovshdup_avx(auVar82);
          auVar83 = vmaxss_avx(auVar83,auVar82);
          auVar82 = vshufpd_avx(auVar82,auVar82,1);
          auVar82 = vmaxss_avx(auVar82,auVar83);
          fVar214 = auVar82._0_4_ * 1.9073486e-06;
          local_640 = vshufps_avx(auVar81,auVar81,0xff);
          local_500 = (float)local_5c0._0_4_ + (float)local_680._0_4_;
          fStack_4fc = (float)local_5c0._4_4_ + (float)local_680._4_4_;
          fStack_4f8 = fStack_5b8 + fStack_678;
          fStack_4f4 = fStack_5b4 + fStack_674;
          fStack_4f0 = fStack_5b0 + fStack_670;
          fStack_4ec = fStack_5ac + fStack_66c;
          fStack_4e8 = fStack_5a8 + fStack_668;
          fStack_4e4 = fStack_5a4 + fStack_664;
          _local_5c0 = auVar100;
          do {
            auVar97 = local_7a0;
            auVar150._8_4_ = 0x7f800000;
            auVar150._0_8_ = 0x7f8000007f800000;
            auVar150._12_4_ = 0x7f800000;
            auVar150._16_4_ = 0x7f800000;
            auVar150._20_4_ = 0x7f800000;
            auVar150._24_4_ = 0x7f800000;
            auVar150._28_4_ = 0x7f800000;
            auVar96 = vblendmps_avx512vl(auVar150,_local_5c0);
            auVar129._0_4_ =
                 (uint)(bVar74 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar74 & 1) * 0x7f800000;
            bVar6 = (bool)(bVar74 >> 1 & 1);
            auVar129._4_4_ = (uint)bVar6 * auVar96._4_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar74 >> 2 & 1);
            auVar129._8_4_ = (uint)bVar6 * auVar96._8_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar74 >> 3 & 1);
            auVar129._12_4_ = (uint)bVar6 * auVar96._12_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar74 >> 4 & 1);
            auVar129._16_4_ = (uint)bVar6 * auVar96._16_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar74 >> 5 & 1);
            auVar129._20_4_ = (uint)bVar6 * auVar96._20_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar74 >> 6 & 1);
            auVar129._24_4_ = (uint)bVar6 * auVar96._24_4_ | (uint)!bVar6 * 0x7f800000;
            auVar129._28_4_ =
                 (uint)(bVar74 >> 7) * auVar96._28_4_ | (uint)!(bool)(bVar74 >> 7) * 0x7f800000;
            auVar96 = vshufps_avx(auVar129,auVar129,0xb1);
            auVar96 = vminps_avx(auVar129,auVar96);
            auVar94 = vshufpd_avx(auVar96,auVar96,5);
            auVar96 = vminps_avx(auVar96,auVar94);
            auVar94 = vpermpd_avx2(auVar96,0x4e);
            auVar96 = vminps_avx(auVar96,auVar94);
            uVar13 = vcmpps_avx512vl(auVar129,auVar96,0);
            bVar72 = (byte)uVar13 & bVar74;
            bVar75 = bVar74;
            if (bVar72 != 0) {
              bVar75 = bVar72;
            }
            iVar16 = 0;
            for (uVar80 = (uint)bVar75; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x80000000) {
              iVar16 = iVar16 + 1;
            }
            auVar237 = ZEXT464(*(uint *)(local_4c0 + (uint)(iVar16 << 2)));
            auVar234 = ZEXT464(*(uint *)(local_460 + (uint)(iVar16 << 2)));
            aVar1 = (ray->super_RayK<1>).dir.field_0;
            local_660._0_16_ = (undefined1  [16])aVar1;
            auVar82 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
            if (auVar82._0_4_ < 0.0) {
              local_8a0._0_16_ = ZEXT416(*(uint *)(local_4c0 + (uint)(iVar16 << 2)));
              local_860._0_16_ = ZEXT416(*(uint *)(local_460 + (uint)(iVar16 << 2)));
              local_7a0[1] = 0;
              local_7a0[0] = bVar74;
              local_7a0._2_30_ = auVar97._2_30_;
              fVar138 = sqrtf(auVar82._0_4_);
              bVar74 = local_7a0[0];
              auVar234 = ZEXT1664(local_860._0_16_);
              auVar237 = ZEXT1664(local_8a0._0_16_);
              auVar246 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            else {
              auVar82 = vsqrtss_avx(auVar82,auVar82);
              fVar138 = auVar82._0_4_;
            }
            lVar77 = 4;
            do {
              local_860._0_16_ = auVar234._0_16_;
              uVar231 = auVar234._0_4_;
              auVar139._4_4_ = uVar231;
              auVar139._0_4_ = uVar231;
              auVar139._8_4_ = uVar231;
              auVar139._12_4_ = uVar231;
              auVar87 = auVar246._0_16_;
              auVar82 = vfmadd132ps_fma(auVar139,auVar87,local_660._0_16_);
              fVar221 = auVar237._0_4_;
              fVar155 = 1.0 - fVar221;
              fVar218 = fVar221 * fVar221;
              auVar86 = SUB6416(ZEXT464(0x40400000),0);
              auVar85 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar236 = auVar237._0_16_;
              auVar81 = vfmadd213ss_fma(auVar86,auVar236,auVar85);
              auVar83 = vfmadd213ss_fma(auVar81,ZEXT416((uint)fVar218),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar84 = vfmadd213ss_fma(auVar86,ZEXT416((uint)fVar155),auVar85);
              auVar84 = vfmadd213ss_fma(auVar84,ZEXT416((uint)(fVar155 * fVar155)),
                                        SUB6416(ZEXT464(0x40000000),0));
              fVar219 = fVar155 * fVar155 * -fVar221 * 0.5;
              fVar220 = auVar83._0_4_ * 0.5;
              fVar222 = auVar84._0_4_ * 0.5;
              fVar221 = fVar221 * fVar221 * -fVar155 * 0.5;
              auVar191._0_4_ = fVar221 * (float)local_700._0_4_;
              auVar191._4_4_ = fVar221 * (float)local_700._4_4_;
              auVar191._8_4_ = fVar221 * fStack_6f8;
              auVar191._12_4_ = fVar221 * fStack_6f4;
              auVar201._4_4_ = fVar222;
              auVar201._0_4_ = fVar222;
              auVar201._8_4_ = fVar222;
              auVar201._12_4_ = fVar222;
              auVar83 = vfmadd132ps_fma(auVar201,auVar191,local_6c0._0_16_);
              auVar175._4_4_ = fVar220;
              auVar175._0_4_ = fVar220;
              auVar175._8_4_ = fVar220;
              auVar175._12_4_ = fVar220;
              auVar83 = vfmadd132ps_fma(auVar175,auVar83,local_6e0._0_16_);
              auVar192._4_4_ = fVar219;
              auVar192._0_4_ = fVar219;
              auVar192._8_4_ = fVar219;
              auVar192._12_4_ = fVar219;
              auVar83 = vfmadd132ps_fma(auVar192,auVar83,local_6a0._0_16_);
              local_5d0 = vfmadd231ss_fma(auVar85,auVar236,ZEXT416(0x41100000));
              local_5e0 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar236,
                                          ZEXT416(0x40800000));
              local_5f0 = vfmadd213ss_fma(auVar86,auVar236,ZEXT416(0xbf800000));
              local_5a0._0_16_ = auVar83;
              auVar82 = vsubps_avx(auVar82,auVar83);
              local_7a0._0_16_ = auVar82;
              auVar82 = vdpps_avx(auVar82,auVar82,0x7f);
              local_8a0._0_16_ = auVar236;
              local_840._0_16_ = auVar82;
              if (auVar82._0_4_ < 0.0) {
                local_780._0_4_ = auVar81._0_4_;
                local_8b0._0_4_ = fVar218;
                local_800._0_4_ = fVar155 * -2.0;
                local_880 = ZEXT416((uint)fVar155);
                auVar245._0_4_ = sqrtf(auVar82._0_4_);
                auVar245._4_60_ = extraout_var;
                auVar81 = ZEXT416((uint)local_780._0_4_);
                auVar87 = ZEXT816(0) << 0x40;
                auVar82 = auVar245._0_16_;
                auVar83 = local_880;
                auVar236 = local_8a0._0_16_;
              }
              else {
                auVar82 = vsqrtss_avx(auVar82,auVar82);
                local_800._0_4_ = fVar155 * -2.0;
                local_8b0._0_4_ = fVar218;
                auVar83 = ZEXT416((uint)fVar155);
              }
              fVar219 = auVar83._0_4_;
              fVar218 = auVar236._0_4_;
              auVar85 = vfnmadd231ss_fma(ZEXT416((uint)(fVar218 * (fVar219 + fVar219))),auVar83,
                                         auVar83);
              auVar83 = vfmadd213ss_fma(auVar81,ZEXT416((uint)(fVar218 + fVar218)),
                                        ZEXT416((uint)(fVar218 * fVar218 * 3.0)));
              auVar81 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar236,
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar219 * fVar219 * -3.0)),
                                        ZEXT416((uint)(fVar219 + fVar219)),auVar81);
              auVar81 = vfmadd213ss_fma(ZEXT416((uint)local_800._0_4_),auVar236,
                                        ZEXT416((uint)local_8b0._0_4_));
              fVar218 = auVar85._0_4_ * 0.5;
              fVar219 = auVar83._0_4_ * 0.5;
              fVar220 = auVar84._0_4_ * 0.5;
              fVar222 = auVar81._0_4_ * 0.5;
              auVar193._0_4_ = fVar222 * (float)local_700._0_4_;
              auVar193._4_4_ = fVar222 * (float)local_700._4_4_;
              auVar193._8_4_ = fVar222 * fStack_6f8;
              auVar193._12_4_ = fVar222 * fStack_6f4;
              auVar176._4_4_ = fVar220;
              auVar176._0_4_ = fVar220;
              auVar176._8_4_ = fVar220;
              auVar176._12_4_ = fVar220;
              auVar83 = vfmadd132ps_fma(auVar176,auVar193,local_6c0._0_16_);
              auVar156._4_4_ = fVar219;
              auVar156._0_4_ = fVar219;
              auVar156._8_4_ = fVar219;
              auVar156._12_4_ = fVar219;
              auVar83 = vfmadd132ps_fma(auVar156,auVar83,local_6e0._0_16_);
              auVar249._4_4_ = fVar218;
              auVar249._0_4_ = fVar218;
              auVar249._8_4_ = fVar218;
              auVar249._12_4_ = fVar218;
              local_780._0_16_ = vfmadd132ps_fma(auVar249,auVar83,local_6a0._0_16_);
              local_800 = vdpps_avx(local_780._0_16_,local_780._0_16_,0x7f);
              fVar219 = local_800._0_4_;
              auVar157._4_12_ = auVar87._4_12_;
              auVar157._0_4_ = fVar219;
              local_8b0 = vrsqrt14ss_avx512f(auVar87,auVar157);
              fVar218 = local_8b0._0_4_ * 1.5;
              local_600 = vrcp14ss_avx512f(auVar87,auVar157);
              auVar17._8_4_ = 0x80000000;
              auVar17._0_8_ = 0x8000000080000000;
              auVar17._12_4_ = 0x80000000;
              auVar81 = vxorps_avx512vl(local_800,auVar17);
              auVar83 = vfnmadd213ss_fma(local_600,local_800,SUB6416(ZEXT464(0x40000000),0));
              local_880._0_4_ = auVar82._0_4_;
              if (fVar219 < auVar81._0_4_) {
                local_810._0_4_ = fVar218;
                auVar246._0_4_ = sqrtf(fVar219);
                auVar246._4_60_ = extraout_var_00;
                auVar82 = ZEXT416((uint)local_880._0_4_);
                auVar87 = ZEXT816(0) << 0x40;
                auVar84 = auVar246._0_16_;
                auVar81 = local_780._0_16_;
              }
              else {
                auVar84 = vsqrtss_avx512f(local_800,local_800);
                local_810._0_4_ = fVar218;
                auVar81 = local_780._0_16_;
              }
              fVar218 = local_8b0._0_4_;
              fVar218 = (float)local_810._0_4_ + fVar219 * -0.5 * fVar218 * fVar218 * fVar218;
              local_810._0_4_ = auVar81._0_4_ * fVar218;
              local_810._4_4_ = auVar81._4_4_ * fVar218;
              local_810._8_4_ = auVar81._8_4_ * fVar218;
              local_810._12_4_ = auVar81._12_4_ * fVar218;
              local_8b0 = vdpps_avx(local_7a0._0_16_,local_810,0x7f);
              fVar220 = auVar82._0_4_;
              auVar140._0_4_ = local_8b0._0_4_ * local_8b0._0_4_;
              auVar140._4_4_ = local_8b0._4_4_ * local_8b0._4_4_;
              auVar140._8_4_ = local_8b0._8_4_ * local_8b0._8_4_;
              auVar140._12_4_ = local_8b0._12_4_ * local_8b0._12_4_;
              auVar236 = vsubps_avx(local_840._0_16_,auVar140);
              fVar219 = auVar236._0_4_;
              auVar158._4_12_ = auVar87._4_12_;
              auVar158._0_4_ = fVar219;
              auVar85 = vrsqrt14ss_avx512f(auVar87,auVar158);
              auVar86 = vmulss_avx512f(auVar85,ZEXT416(0x3fc00000));
              auVar87 = vmulss_avx512f(auVar236,ZEXT416(0xbf000000));
              if (fVar219 < 0.0) {
                local_620 = fVar218;
                fStack_61c = fVar218;
                fStack_618 = fVar218;
                fStack_614 = fVar218;
                local_610 = auVar85;
                fVar219 = sqrtf(fVar219);
                auVar87 = ZEXT416(auVar87._0_4_);
                auVar86 = ZEXT416(auVar86._0_4_);
                auVar84 = ZEXT416(auVar84._0_4_);
                auVar82 = ZEXT416((uint)local_880._0_4_);
                auVar236 = local_840._0_16_;
                auVar81 = local_780._0_16_;
                auVar85 = local_610;
                fVar218 = local_620;
                fVar222 = fStack_61c;
                fVar221 = fStack_618;
                fVar155 = fStack_614;
              }
              else {
                auVar236 = vsqrtss_avx(auVar236,auVar236);
                fVar219 = auVar236._0_4_;
                auVar236 = local_840._0_16_;
                fVar222 = fVar218;
                fVar221 = fVar218;
                fVar155 = fVar218;
              }
              auVar245 = ZEXT1664(auVar236);
              auVar247._8_4_ = 0x7fffffff;
              auVar247._0_8_ = 0x7fffffff7fffffff;
              auVar247._12_4_ = 0x7fffffff;
              auVar159._0_4_ = (float)local_5f0._0_4_ * (float)local_700._0_4_;
              auVar159._4_4_ = (float)local_5f0._0_4_ * (float)local_700._4_4_;
              auVar159._8_4_ = (float)local_5f0._0_4_ * fStack_6f8;
              auVar159._12_4_ = (float)local_5f0._0_4_ * fStack_6f4;
              auVar177._4_4_ = local_5e0._0_4_;
              auVar177._0_4_ = local_5e0._0_4_;
              auVar177._8_4_ = local_5e0._0_4_;
              auVar177._12_4_ = local_5e0._0_4_;
              auVar90 = vfmadd132ps_fma(auVar177,auVar159,local_6c0._0_16_);
              auVar160._4_4_ = local_5d0._0_4_;
              auVar160._0_4_ = local_5d0._0_4_;
              auVar160._8_4_ = local_5d0._0_4_;
              auVar160._12_4_ = local_5d0._0_4_;
              auVar90 = vfmadd132ps_fma(auVar160,auVar90,local_6e0._0_16_);
              auVar89 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),local_8a0._0_16_,
                                        ZEXT416(0x40000000));
              auVar178._0_4_ = auVar89._0_4_;
              auVar178._4_4_ = auVar178._0_4_;
              auVar178._8_4_ = auVar178._0_4_;
              auVar178._12_4_ = auVar178._0_4_;
              auVar90 = vfmadd132ps_fma(auVar178,auVar90,local_6a0._0_16_);
              auVar161._0_4_ = auVar90._0_4_ * (float)local_800._0_4_;
              auVar161._4_4_ = auVar90._4_4_ * (float)local_800._0_4_;
              auVar161._8_4_ = auVar90._8_4_ * (float)local_800._0_4_;
              auVar161._12_4_ = auVar90._12_4_ * (float)local_800._0_4_;
              auVar90 = vdpps_avx(auVar81,auVar90,0x7f);
              fVar190 = auVar90._0_4_;
              auVar179._0_4_ = auVar81._0_4_ * fVar190;
              auVar179._4_4_ = auVar81._4_4_ * fVar190;
              auVar179._8_4_ = auVar81._8_4_ * fVar190;
              auVar179._12_4_ = auVar81._12_4_ * fVar190;
              auVar90 = vsubps_avx(auVar161,auVar179);
              fVar190 = auVar83._0_4_ * (float)local_600._0_4_;
              auVar18._8_4_ = 0x80000000;
              auVar18._0_8_ = 0x8000000080000000;
              auVar18._12_4_ = 0x80000000;
              auVar88 = vxorps_avx512vl(auVar81,auVar18);
              auVar202._0_4_ = fVar218 * auVar90._0_4_ * fVar190;
              auVar202._4_4_ = fVar222 * auVar90._4_4_ * fVar190;
              auVar202._8_4_ = fVar221 * auVar90._8_4_ * fVar190;
              auVar202._12_4_ = fVar155 * auVar90._12_4_ * fVar190;
              auVar83 = vdpps_avx(auVar88,local_810,0x7f);
              auVar90 = vmaxss_avx(ZEXT416((uint)fVar214),
                                   ZEXT416((uint)((float)local_860._0_4_ * fVar138 * 1.9073486e-06))
                                  );
              auVar89 = vdivss_avx512f(ZEXT416((uint)fVar214),auVar84);
              auVar84 = vdpps_avx(local_7a0._0_16_,auVar202,0x7f);
              auVar82 = vfmadd213ss_fma(auVar82,ZEXT416((uint)fVar214),auVar90);
              auVar89 = vfmadd213ss_fma(ZEXT416((uint)(fVar220 + 1.0)),auVar89,auVar82);
              auVar82 = vdpps_avx(local_660._0_16_,local_810,0x7f);
              fVar218 = auVar83._0_4_ + auVar84._0_4_;
              auVar83 = vdpps_avx(local_7a0._0_16_,auVar88,0x7f);
              auVar87 = vmulss_avx512f(auVar87,auVar85);
              auVar85 = vmulss_avx512f(auVar85,auVar85);
              auVar84 = vdpps_avx(local_7a0._0_16_,local_660._0_16_,0x7f);
              auVar85 = vaddss_avx512f(auVar86,ZEXT416((uint)(auVar87._0_4_ * auVar85._0_4_)));
              auVar86 = vfnmadd231ss_avx512f(auVar83,local_8b0,ZEXT416((uint)fVar218));
              auVar87 = vfnmadd231ss_avx512f(auVar84,local_8b0,auVar82);
              auVar83 = vpermilps_avx(local_5a0._0_16_,0xff);
              fVar219 = fVar219 - auVar83._0_4_;
              auVar83 = vshufps_avx(auVar81,auVar81,0xff);
              auVar84 = vfmsub213ss_fma(auVar86,auVar85,auVar83);
              fVar220 = auVar87._0_4_ * auVar85._0_4_;
              auVar85 = vfmsub231ss_fma(ZEXT416((uint)(auVar82._0_4_ * auVar84._0_4_)),
                                        ZEXT416((uint)fVar218),ZEXT416((uint)fVar220));
              fVar222 = auVar85._0_4_;
              auVar215._0_4_ = fVar220 / fVar222;
              auVar215._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar211._0_4_ = auVar84._0_4_ / fVar222;
              auVar211._4_12_ = auVar84._4_12_;
              auVar84 = vmulss_avx512f(local_8b0,auVar215);
              auVar85 = vmulss_avx512f(local_8b0,auVar211);
              fVar220 = local_8a0._0_4_ - (auVar84._0_4_ - fVar219 * (auVar82._0_4_ / fVar222));
              auVar237 = ZEXT464((uint)fVar220);
              fVar218 = (float)local_860._0_4_ - (fVar219 * (fVar218 / fVar222) - auVar85._0_4_);
              auVar234 = ZEXT464((uint)fVar218);
              auVar82 = vandps_avx512vl(local_8b0,auVar247);
              if (auVar89._0_4_ <= auVar82._0_4_) {
                bVar6 = false;
                auVar246 = ZEXT864(0) << 0x20;
              }
              else {
                auVar84 = vfmadd231ss_fma(ZEXT416((uint)(auVar89._0_4_ + auVar90._0_4_)),local_640,
                                          ZEXT416(0x36000000));
                auVar82 = vandps_avx(auVar247,ZEXT416((uint)fVar219));
                auVar59._12_4_ = 0;
                auVar59._0_12_ = ZEXT812(0);
                auVar246 = ZEXT1264(ZEXT812(0)) << 0x20;
                if (auVar84._0_4_ <= auVar82._0_4_) {
                  bVar6 = false;
                }
                else {
                  fVar218 = fVar218 + (float)local_630._0_4_;
                  auVar234 = ZEXT464((uint)fVar218);
                  bVar6 = true;
                  if (((((ray->super_RayK<1>).org.field_0.m128[3] <= fVar218) &&
                       (fVar219 = (ray->super_RayK<1>).tfar, fVar218 <= fVar219)) &&
                      (0.0 <= fVar220)) && (fVar220 <= 1.0)) {
                    auVar82 = vrsqrt14ss_avx512f(auVar59 << 0x20,ZEXT416((uint)auVar236._0_4_));
                    fVar222 = auVar82._0_4_;
                    pGVar4 = (context->scene->geometries).items[local_8b8].ptr;
                    if ((pGVar4->mask & (ray->super_RayK<1>).mask) != 0) {
                      fVar222 = fVar222 * 1.5 + auVar236._0_4_ * -0.5 * fVar222 * fVar222 * fVar222;
                      auVar162._0_4_ = local_7a0._0_4_ * fVar222;
                      auVar162._4_4_ = local_7a0._4_4_ * fVar222;
                      auVar162._8_4_ = local_7a0._8_4_ * fVar222;
                      auVar162._12_4_ = local_7a0._12_4_ * fVar222;
                      auVar84 = vfmadd213ps_fma(auVar83,auVar162,auVar81);
                      auVar82 = vshufps_avx(auVar162,auVar162,0xc9);
                      auVar83 = vshufps_avx(auVar81,auVar81,0xc9);
                      auVar163._0_4_ = auVar162._0_4_ * auVar83._0_4_;
                      auVar163._4_4_ = auVar162._4_4_ * auVar83._4_4_;
                      auVar163._8_4_ = auVar162._8_4_ * auVar83._8_4_;
                      auVar163._12_4_ = auVar162._12_4_ * auVar83._12_4_;
                      auVar81 = vfmsub231ps_fma(auVar163,auVar81,auVar82);
                      auVar82 = vshufps_avx(auVar81,auVar81,0xc9);
                      auVar83 = vshufps_avx(auVar84,auVar84,0xc9);
                      auVar81 = vshufps_avx(auVar81,auVar81,0xd2);
                      auVar141._0_4_ = auVar84._0_4_ * auVar81._0_4_;
                      auVar141._4_4_ = auVar84._4_4_ * auVar81._4_4_;
                      auVar141._8_4_ = auVar84._8_4_ * auVar81._8_4_;
                      auVar141._12_4_ = auVar84._12_4_ * auVar81._12_4_;
                      auVar82 = vfmsub231ps_fma(auVar141,auVar82,auVar83);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = fVar218;
                        auVar83 = vshufps_avx(auVar82,auVar82,0xe9);
                        uVar13 = vmovlps_avx(auVar83);
                        *(undefined8 *)&(ray->Ng).field_0 = uVar13;
                        (ray->Ng).field_0.field_0.z = auVar82._0_4_;
                        ray->u = fVar220;
                        ray->v = 0.0;
                        ray->primID = (uint)local_868;
                        ray->geomID = (uint)local_8b8;
                        ray->instID[0] = context->user->instID[0];
                        ray->instPrimID[0] = context->user->instPrimID[0];
                      }
                      else {
                        auVar83 = vshufps_avx(auVar82,auVar82,0xe9);
                        local_750 = vmovlps_avx(auVar83);
                        local_748 = auVar82._0_4_;
                        local_744 = fVar220;
                        local_740 = 0;
                        local_73c = (uint)local_868;
                        local_738 = (uint)local_8b8;
                        local_734 = context->user->instID[0];
                        local_730 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = fVar218;
                        local_8bc = -1;
                        local_7e0.valid = &local_8bc;
                        local_7e0.geometryUserPtr = pGVar4->userPtr;
                        local_7e0.context = context->user;
                        local_7e0.ray = (RTCRayN *)ray;
                        local_7e0.hit = (RTCHitN *)&local_750;
                        local_7e0.N = 1;
                        local_8a0._0_16_ = ZEXT416((uint)fVar220);
                        local_860._0_16_ = ZEXT416((uint)fVar218);
                        local_840._0_4_ = fVar219;
                        if (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01da606e:
                          p_Var5 = context->args->filter;
                          if (p_Var5 != (RTCFilterFunctionN)0x0) {
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar4->field_8).field_0x2 & 0x40) != 0)) {
                              auVar245 = ZEXT1664(auVar245._0_16_);
                              (*p_Var5)(&local_7e0);
                              auVar234 = ZEXT1664(local_860._0_16_);
                              auVar237 = ZEXT1664(local_8a0._0_16_);
                              auVar247._8_4_ = 0x7fffffff;
                              auVar247._0_8_ = 0x7fffffff7fffffff;
                              auVar247._12_4_ = 0x7fffffff;
                              auVar246 = ZEXT1664(ZEXT816(0) << 0x40);
                              fVar219 = (float)local_840._0_4_;
                            }
                            if (*local_7e0.valid == 0) goto LAB_01da6127;
                          }
                          (((Vec3f *)((long)local_7e0.ray + 0x30))->field_0).components[0] =
                               *(float *)local_7e0.hit;
                          (((Vec3f *)((long)local_7e0.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_7e0.hit + 4);
                          (((Vec3f *)((long)local_7e0.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_7e0.hit + 8);
                          *(float *)((long)local_7e0.ray + 0x3c) = *(float *)(local_7e0.hit + 0xc);
                          *(float *)((long)local_7e0.ray + 0x40) = *(float *)(local_7e0.hit + 0x10);
                          *(float *)((long)local_7e0.ray + 0x44) = *(float *)(local_7e0.hit + 0x14);
                          *(float *)((long)local_7e0.ray + 0x48) = *(float *)(local_7e0.hit + 0x18);
                          *(float *)((long)local_7e0.ray + 0x4c) = *(float *)(local_7e0.hit + 0x1c);
                          *(float *)((long)local_7e0.ray + 0x50) = *(float *)(local_7e0.hit + 0x20);
                        }
                        else {
                          auVar245 = ZEXT1664(auVar236);
                          (*pGVar4->intersectionFilterN)(&local_7e0);
                          auVar234 = ZEXT1664(local_860._0_16_);
                          auVar237 = ZEXT1664(local_8a0._0_16_);
                          auVar247._8_4_ = 0x7fffffff;
                          auVar247._0_8_ = 0x7fffffff7fffffff;
                          auVar247._12_4_ = 0x7fffffff;
                          auVar246 = ZEXT1664(ZEXT816(0) << 0x40);
                          fVar219 = (float)local_840._0_4_;
                          if (*local_7e0.valid != 0) goto LAB_01da606e;
LAB_01da6127:
                          (ray->super_RayK<1>).tfar = fVar219;
                        }
                      }
                    }
                  }
                }
              }
              bVar78 = lVar77 != 0;
              lVar77 = lVar77 + -1;
            } while ((!bVar6) && (bVar78));
            auVar64._4_4_ = fStack_4fc;
            auVar64._0_4_ = local_500;
            auVar64._8_4_ = fStack_4f8;
            auVar64._12_4_ = fStack_4f4;
            auVar64._16_4_ = fStack_4f0;
            auVar64._20_4_ = fStack_4ec;
            auVar64._24_4_ = fStack_4e8;
            auVar64._28_4_ = fStack_4e4;
            fVar138 = (ray->super_RayK<1>).tfar;
            auVar31._4_4_ = fVar138;
            auVar31._0_4_ = fVar138;
            auVar31._8_4_ = fVar138;
            auVar31._12_4_ = fVar138;
            auVar31._16_4_ = fVar138;
            auVar31._20_4_ = fVar138;
            auVar31._24_4_ = fVar138;
            auVar31._28_4_ = fVar138;
            uVar13 = vcmpps_avx512vl(auVar64,auVar31,2);
            bVar74 = ~('\x01' << ((byte)iVar16 & 0x1f)) & bVar74 & (byte)uVar13;
          } while (bVar74 != 0);
        }
        auVar151._0_4_ = (float)local_580._0_4_ + (float)local_680._0_4_;
        auVar151._4_4_ = (float)local_580._4_4_ + (float)local_680._4_4_;
        auVar151._8_4_ = fStack_578 + fStack_678;
        auVar151._12_4_ = fStack_574 + fStack_674;
        auVar151._16_4_ = fStack_570 + fStack_670;
        auVar151._20_4_ = fStack_56c + fStack_66c;
        auVar151._24_4_ = fStack_568 + fStack_668;
        auVar151._28_4_ = fStack_564 + fStack_664;
        fVar214 = (ray->super_RayK<1>).tfar;
        auVar32._4_4_ = fVar214;
        auVar32._0_4_ = fVar214;
        auVar32._8_4_ = fVar214;
        auVar32._12_4_ = fVar214;
        auVar32._16_4_ = fVar214;
        auVar32._20_4_ = fVar214;
        auVar32._24_4_ = fVar214;
        auVar32._28_4_ = fVar214;
        uVar13 = vcmpps_avx512vl(auVar151,auVar32,2);
        bVar75 = (byte)local_7a4 | (byte)local_7ac;
        bVar71 = (byte)uVar14 & bVar71 & (byte)uVar13;
        auVar152._8_4_ = 2;
        auVar152._0_8_ = 0x200000002;
        auVar152._12_4_ = 2;
        auVar152._16_4_ = 2;
        auVar152._20_4_ = 2;
        auVar152._24_4_ = 2;
        auVar152._28_4_ = 2;
        auVar33._8_4_ = 3;
        auVar33._0_8_ = 0x300000003;
        auVar33._12_4_ = 3;
        auVar33._16_4_ = 3;
        auVar33._20_4_ = 3;
        auVar33._24_4_ = 3;
        auVar33._28_4_ = 3;
        auVar96 = vpblendmd_avx512vl(auVar152,auVar33);
        local_580._0_4_ = (uint)(bVar75 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar75 & 1) * 2;
        bVar6 = (bool)(bVar75 >> 1 & 1);
        local_580._4_4_ = (uint)bVar6 * auVar96._4_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar75 >> 2 & 1);
        fStack_578 = (float)((uint)bVar6 * auVar96._8_4_ | (uint)!bVar6 * 2);
        bVar6 = (bool)(bVar75 >> 3 & 1);
        fStack_574 = (float)((uint)bVar6 * auVar96._12_4_ | (uint)!bVar6 * 2);
        bVar6 = (bool)(bVar75 >> 4 & 1);
        fStack_570 = (float)((uint)bVar6 * auVar96._16_4_ | (uint)!bVar6 * 2);
        bVar6 = (bool)(bVar75 >> 5 & 1);
        fStack_56c = (float)((uint)bVar6 * auVar96._20_4_ | (uint)!bVar6 * 2);
        bVar6 = (bool)(bVar75 >> 6 & 1);
        fStack_568 = (float)((uint)bVar6 * auVar96._24_4_ | (uint)!bVar6 * 2);
        fStack_564 = (float)((uint)(bVar75 >> 7) * auVar96._28_4_ | (uint)!(bool)(bVar75 >> 7) * 2);
        uVar13 = vpcmpd_avx512vl(_local_580,local_4a0,2);
        bVar75 = (byte)uVar13 & bVar71;
        if (bVar75 != 0) {
          auVar83 = vminps_avx(local_6a0._0_16_,local_6e0._0_16_);
          auVar82 = vmaxps_avx(local_6a0._0_16_,local_6e0._0_16_);
          auVar81 = vminps_avx(local_6c0._0_16_,local_700._0_16_);
          auVar84 = vminps_avx(auVar83,auVar81);
          auVar83 = vmaxps_avx(local_6c0._0_16_,local_700._0_16_);
          auVar81 = vmaxps_avx(auVar82,auVar83);
          auVar82 = vandps_avx(auVar247,auVar84);
          auVar83 = vandps_avx(auVar247,auVar81);
          auVar82 = vmaxps_avx(auVar82,auVar83);
          auVar83 = vmovshdup_avx(auVar82);
          auVar83 = vmaxss_avx(auVar83,auVar82);
          auVar82 = vshufpd_avx(auVar82,auVar82,1);
          auVar82 = vmaxss_avx(auVar82,auVar83);
          fVar214 = auVar82._0_4_ * 1.9073486e-06;
          local_640 = vshufps_avx(auVar81,auVar81,0xff);
          _local_5c0 = _local_420;
          local_500 = (float)local_420._0_4_ + (float)local_680._0_4_;
          fStack_4fc = (float)local_420._4_4_ + (float)local_680._4_4_;
          fStack_4f8 = fStack_418 + fStack_678;
          fStack_4f4 = fStack_414 + fStack_674;
          fStack_4f0 = fStack_410 + fStack_670;
          fStack_4ec = fStack_40c + fStack_66c;
          fStack_4e8 = fStack_408 + fStack_668;
          fStack_4e4 = fStack_404 + fStack_664;
          do {
            auVar97 = local_7a0;
            auVar153._8_4_ = 0x7f800000;
            auVar153._0_8_ = 0x7f8000007f800000;
            auVar153._12_4_ = 0x7f800000;
            auVar153._16_4_ = 0x7f800000;
            auVar153._20_4_ = 0x7f800000;
            auVar153._24_4_ = 0x7f800000;
            auVar153._28_4_ = 0x7f800000;
            auVar96 = vblendmps_avx512vl(auVar153,_local_5c0);
            auVar130._0_4_ =
                 (uint)(bVar75 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar75 & 1) * 0x7f800000;
            bVar6 = (bool)(bVar75 >> 1 & 1);
            auVar130._4_4_ = (uint)bVar6 * auVar96._4_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar75 >> 2 & 1);
            auVar130._8_4_ = (uint)bVar6 * auVar96._8_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar75 >> 3 & 1);
            auVar130._12_4_ = (uint)bVar6 * auVar96._12_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar75 >> 4 & 1);
            auVar130._16_4_ = (uint)bVar6 * auVar96._16_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar75 >> 5 & 1);
            auVar130._20_4_ = (uint)bVar6 * auVar96._20_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar75 >> 6 & 1);
            auVar130._24_4_ = (uint)bVar6 * auVar96._24_4_ | (uint)!bVar6 * 0x7f800000;
            auVar130._28_4_ =
                 (uint)(bVar75 >> 7) * auVar96._28_4_ | (uint)!(bool)(bVar75 >> 7) * 0x7f800000;
            auVar96 = vshufps_avx(auVar130,auVar130,0xb1);
            auVar96 = vminps_avx(auVar130,auVar96);
            auVar94 = vshufpd_avx(auVar96,auVar96,5);
            auVar96 = vminps_avx(auVar96,auVar94);
            auVar94 = vpermpd_avx2(auVar96,0x4e);
            auVar96 = vminps_avx(auVar96,auVar94);
            uVar13 = vcmpps_avx512vl(auVar130,auVar96,0);
            bVar72 = (byte)uVar13 & bVar75;
            bVar74 = bVar75;
            if (bVar72 != 0) {
              bVar74 = bVar72;
            }
            iVar16 = 0;
            for (uVar80 = (uint)bVar74; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x80000000) {
              iVar16 = iVar16 + 1;
            }
            auVar237 = ZEXT464(*(uint *)(local_4e0 + (uint)(iVar16 << 2)));
            aVar1 = (ray->super_RayK<1>).dir.field_0;
            local_660._0_16_ = (undefined1  [16])aVar1;
            auVar82 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
            if (auVar82._0_4_ < 0.0) {
              local_8a0._0_16_ = ZEXT416(*(uint *)(local_4e0 + (uint)(iVar16 << 2)));
              local_860._0_16_ = ZEXT416((uint)*(float *)(local_400 + (uint)(iVar16 << 2)));
              local_7a0[1] = 0;
              local_7a0[0] = bVar75;
              local_7a0._2_30_ = auVar97._2_30_;
              fVar218 = sqrtf(auVar82._0_4_);
              bVar75 = local_7a0[0];
              auVar237 = ZEXT1664(local_8a0._0_16_);
              auVar246 = ZEXT1664(ZEXT816(0) << 0x40);
              fVar138 = (float)local_860._0_4_;
              uVar231 = local_860._4_4_;
              uVar242 = local_860._8_4_;
              uVar243 = local_860._12_4_;
            }
            else {
              auVar82 = vsqrtss_avx(auVar82,auVar82);
              fVar218 = auVar82._0_4_;
              fVar138 = *(float *)(local_400 + (uint)(iVar16 << 2));
              uVar231 = 0;
              uVar242 = 0;
              uVar243 = 0;
            }
            lVar77 = 4;
            do {
              auVar96 = local_860;
              auVar142._4_4_ = fVar138;
              auVar142._0_4_ = fVar138;
              auVar142._8_4_ = fVar138;
              auVar142._12_4_ = fVar138;
              auVar87 = auVar246._0_16_;
              auVar82 = vfmadd132ps_fma(auVar142,auVar87,local_660._0_16_);
              fVar155 = auVar237._0_4_;
              fVar190 = 1.0 - fVar155;
              fVar219 = fVar155 * fVar155;
              auVar86 = SUB6416(ZEXT464(0x40400000),0);
              auVar85 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar236 = auVar237._0_16_;
              auVar81 = vfmadd213ss_fma(auVar86,auVar236,auVar85);
              auVar83 = vfmadd213ss_fma(auVar81,ZEXT416((uint)fVar219),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar84 = vfmadd213ss_fma(auVar86,ZEXT416((uint)fVar190),auVar85);
              auVar84 = vfmadd213ss_fma(auVar84,ZEXT416((uint)(fVar190 * fVar190)),
                                        SUB6416(ZEXT464(0x40000000),0));
              fVar220 = fVar190 * fVar190 * -fVar155 * 0.5;
              fVar222 = auVar83._0_4_ * 0.5;
              fVar221 = auVar84._0_4_ * 0.5;
              fVar155 = fVar155 * fVar155 * -fVar190 * 0.5;
              auVar194._0_4_ = fVar155 * (float)local_700._0_4_;
              auVar194._4_4_ = fVar155 * (float)local_700._4_4_;
              auVar194._8_4_ = fVar155 * fStack_6f8;
              auVar194._12_4_ = fVar155 * fStack_6f4;
              auVar203._4_4_ = fVar221;
              auVar203._0_4_ = fVar221;
              auVar203._8_4_ = fVar221;
              auVar203._12_4_ = fVar221;
              auVar83 = vfmadd132ps_fma(auVar203,auVar194,local_6c0._0_16_);
              auVar180._4_4_ = fVar222;
              auVar180._0_4_ = fVar222;
              auVar180._8_4_ = fVar222;
              auVar180._12_4_ = fVar222;
              auVar83 = vfmadd132ps_fma(auVar180,auVar83,local_6e0._0_16_);
              auVar195._4_4_ = fVar220;
              auVar195._0_4_ = fVar220;
              auVar195._8_4_ = fVar220;
              auVar195._12_4_ = fVar220;
              auVar83 = vfmadd132ps_fma(auVar195,auVar83,local_6a0._0_16_);
              local_5d0 = vfmadd231ss_fma(auVar85,auVar236,ZEXT416(0x41100000));
              local_5e0 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar236,
                                          ZEXT416(0x40800000));
              local_5f0 = vfmadd213ss_fma(auVar86,auVar236,ZEXT416(0xbf800000));
              local_5a0._0_16_ = auVar83;
              auVar82 = vsubps_avx(auVar82,auVar83);
              local_7a0._0_16_ = auVar82;
              auVar82 = vdpps_avx(auVar82,auVar82,0x7f);
              local_8a0._0_16_ = auVar236;
              local_840._0_16_ = auVar82;
              local_860._4_4_ = uVar231;
              local_860._0_4_ = fVar138;
              local_860._8_4_ = uVar242;
              local_860._16_16_ = auVar96._16_16_;
              local_860._12_4_ = uVar243;
              if (auVar82._0_4_ < 0.0) {
                local_780._0_4_ = auVar81._0_4_;
                local_8b0._0_4_ = fVar219;
                local_800._0_4_ = fVar190 * -2.0;
                local_880 = ZEXT416((uint)fVar190);
                auVar237._0_4_ = sqrtf(auVar82._0_4_);
                auVar237._4_60_ = extraout_var_01;
                auVar81 = ZEXT416((uint)local_780._0_4_);
                auVar87 = ZEXT816(0) << 0x40;
                auVar82 = auVar237._0_16_;
                auVar83 = local_880;
                auVar236 = local_8a0._0_16_;
              }
              else {
                auVar82 = vsqrtss_avx(auVar82,auVar82);
                local_800._0_4_ = fVar190 * -2.0;
                local_8b0._0_4_ = fVar219;
                auVar83 = ZEXT416((uint)fVar190);
              }
              fVar219 = auVar83._0_4_;
              fVar138 = auVar236._0_4_;
              auVar85 = vfnmadd231ss_fma(ZEXT416((uint)(fVar138 * (fVar219 + fVar219))),auVar83,
                                         auVar83);
              auVar83 = vfmadd213ss_fma(auVar81,ZEXT416((uint)(fVar138 + fVar138)),
                                        ZEXT416((uint)(fVar138 * fVar138 * 3.0)));
              auVar81 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar236,
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar219 * fVar219 * -3.0)),
                                        ZEXT416((uint)(fVar219 + fVar219)),auVar81);
              auVar81 = vfmadd213ss_fma(ZEXT416((uint)local_800._0_4_),auVar236,
                                        ZEXT416((uint)local_8b0._0_4_));
              fVar138 = auVar85._0_4_ * 0.5;
              fVar219 = auVar83._0_4_ * 0.5;
              fVar220 = auVar84._0_4_ * 0.5;
              fVar222 = auVar81._0_4_ * 0.5;
              auVar196._0_4_ = fVar222 * (float)local_700._0_4_;
              auVar196._4_4_ = fVar222 * (float)local_700._4_4_;
              auVar196._8_4_ = fVar222 * fStack_6f8;
              auVar196._12_4_ = fVar222 * fStack_6f4;
              auVar181._4_4_ = fVar220;
              auVar181._0_4_ = fVar220;
              auVar181._8_4_ = fVar220;
              auVar181._12_4_ = fVar220;
              auVar83 = vfmadd132ps_fma(auVar181,auVar196,local_6c0._0_16_);
              auVar164._4_4_ = fVar219;
              auVar164._0_4_ = fVar219;
              auVar164._8_4_ = fVar219;
              auVar164._12_4_ = fVar219;
              auVar83 = vfmadd132ps_fma(auVar164,auVar83,local_6e0._0_16_);
              auVar250._4_4_ = fVar138;
              auVar250._0_4_ = fVar138;
              auVar250._8_4_ = fVar138;
              auVar250._12_4_ = fVar138;
              local_780._0_16_ = vfmadd132ps_fma(auVar250,auVar83,local_6a0._0_16_);
              local_800 = vdpps_avx(local_780._0_16_,local_780._0_16_,0x7f);
              fVar219 = local_800._0_4_;
              auVar165._4_12_ = auVar87._4_12_;
              auVar165._0_4_ = fVar219;
              local_8b0 = vrsqrt14ss_avx512f(auVar87,auVar165);
              fVar138 = local_8b0._0_4_ * 1.5;
              local_600 = vrcp14ss_avx512f(auVar87,auVar165);
              auVar19._8_4_ = 0x80000000;
              auVar19._0_8_ = 0x8000000080000000;
              auVar19._12_4_ = 0x80000000;
              auVar81 = vxorps_avx512vl(local_800,auVar19);
              auVar83 = vfnmadd213ss_fma(local_600,local_800,SUB6416(ZEXT464(0x40000000),0));
              local_880._0_4_ = auVar82._0_4_;
              if (fVar219 < auVar81._0_4_) {
                local_810._0_4_ = fVar138;
                auVar154._0_4_ = sqrtf(fVar219);
                auVar154._4_60_ = extraout_var_02;
                auVar82 = ZEXT416((uint)local_880._0_4_);
                auVar87 = ZEXT816(0) << 0x40;
                auVar84 = auVar154._0_16_;
                auVar81 = local_780._0_16_;
              }
              else {
                auVar84 = vsqrtss_avx512f(local_800,local_800);
                local_810._0_4_ = fVar138;
                auVar81 = local_780._0_16_;
              }
              fVar138 = local_8b0._0_4_;
              fVar138 = (float)local_810._0_4_ + fVar219 * -0.5 * fVar138 * fVar138 * fVar138;
              local_810._0_4_ = auVar81._0_4_ * fVar138;
              local_810._4_4_ = auVar81._4_4_ * fVar138;
              local_810._8_4_ = auVar81._8_4_ * fVar138;
              local_810._12_4_ = auVar81._12_4_ * fVar138;
              local_8b0 = vdpps_avx(local_7a0._0_16_,local_810,0x7f);
              fVar220 = auVar82._0_4_;
              auVar143._0_4_ = local_8b0._0_4_ * local_8b0._0_4_;
              auVar143._4_4_ = local_8b0._4_4_ * local_8b0._4_4_;
              auVar143._8_4_ = local_8b0._8_4_ * local_8b0._8_4_;
              auVar143._12_4_ = local_8b0._12_4_ * local_8b0._12_4_;
              auVar236 = vsubps_avx(local_840._0_16_,auVar143);
              fVar219 = auVar236._0_4_;
              auVar166._4_12_ = auVar87._4_12_;
              auVar166._0_4_ = fVar219;
              auVar85 = vrsqrt14ss_avx512f(auVar87,auVar166);
              auVar86 = vmulss_avx512f(auVar85,ZEXT416(0x3fc00000));
              auVar87 = vmulss_avx512f(auVar236,ZEXT416(0xbf000000));
              if (fVar219 < 0.0) {
                local_620 = fVar138;
                fStack_61c = fVar138;
                fStack_618 = fVar138;
                fStack_614 = fVar138;
                local_610 = auVar85;
                fVar219 = sqrtf(fVar219);
                auVar87 = ZEXT416(auVar87._0_4_);
                auVar86 = ZEXT416(auVar86._0_4_);
                auVar84 = ZEXT416(auVar84._0_4_);
                auVar82 = ZEXT416((uint)local_880._0_4_);
                auVar81 = local_780._0_16_;
                auVar85 = local_610;
                fVar138 = local_620;
                fVar222 = fStack_61c;
                fVar221 = fStack_618;
                fVar155 = fStack_614;
              }
              else {
                auVar236 = vsqrtss_avx(auVar236,auVar236);
                fVar219 = auVar236._0_4_;
                fVar222 = fVar138;
                fVar221 = fVar138;
                fVar155 = fVar138;
              }
              auVar245 = ZEXT1664(local_7a0._0_16_);
              auVar233._8_4_ = 0x7fffffff;
              auVar233._0_8_ = 0x7fffffff7fffffff;
              auVar233._12_4_ = 0x7fffffff;
              auVar234 = ZEXT1664(auVar233);
              auVar167._0_4_ = (float)local_5f0._0_4_ * (float)local_700._0_4_;
              auVar167._4_4_ = (float)local_5f0._0_4_ * (float)local_700._4_4_;
              auVar167._8_4_ = (float)local_5f0._0_4_ * fStack_6f8;
              auVar167._12_4_ = (float)local_5f0._0_4_ * fStack_6f4;
              auVar182._4_4_ = local_5e0._0_4_;
              auVar182._0_4_ = local_5e0._0_4_;
              auVar182._8_4_ = local_5e0._0_4_;
              auVar182._12_4_ = local_5e0._0_4_;
              auVar236 = vfmadd132ps_fma(auVar182,auVar167,local_6c0._0_16_);
              auVar168._4_4_ = local_5d0._0_4_;
              auVar168._0_4_ = local_5d0._0_4_;
              auVar168._8_4_ = local_5d0._0_4_;
              auVar168._12_4_ = local_5d0._0_4_;
              auVar236 = vfmadd132ps_fma(auVar168,auVar236,local_6e0._0_16_);
              auVar90 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),local_8a0._0_16_,
                                        ZEXT416(0x40000000));
              auVar183._0_4_ = auVar90._0_4_;
              auVar183._4_4_ = auVar183._0_4_;
              auVar183._8_4_ = auVar183._0_4_;
              auVar183._12_4_ = auVar183._0_4_;
              auVar236 = vfmadd132ps_fma(auVar183,auVar236,local_6a0._0_16_);
              auVar169._0_4_ = auVar236._0_4_ * (float)local_800._0_4_;
              auVar169._4_4_ = auVar236._4_4_ * (float)local_800._0_4_;
              auVar169._8_4_ = auVar236._8_4_ * (float)local_800._0_4_;
              auVar169._12_4_ = auVar236._12_4_ * (float)local_800._0_4_;
              auVar236 = vdpps_avx(auVar81,auVar236,0x7f);
              fVar190 = auVar236._0_4_;
              auVar184._0_4_ = auVar81._0_4_ * fVar190;
              auVar184._4_4_ = auVar81._4_4_ * fVar190;
              auVar184._8_4_ = auVar81._8_4_ * fVar190;
              auVar184._12_4_ = auVar81._12_4_ * fVar190;
              auVar236 = vsubps_avx(auVar169,auVar184);
              fVar190 = auVar83._0_4_ * (float)local_600._0_4_;
              auVar20._8_4_ = 0x80000000;
              auVar20._0_8_ = 0x8000000080000000;
              auVar20._12_4_ = 0x80000000;
              auVar89 = vxorps_avx512vl(auVar81,auVar20);
              auVar204._0_4_ = fVar138 * auVar236._0_4_ * fVar190;
              auVar204._4_4_ = fVar222 * auVar236._4_4_ * fVar190;
              auVar204._8_4_ = fVar221 * auVar236._8_4_ * fVar190;
              auVar204._12_4_ = fVar155 * auVar236._12_4_ * fVar190;
              auVar83 = vdpps_avx(auVar89,local_810,0x7f);
              auVar236 = vmaxss_avx(ZEXT416((uint)fVar214),
                                    ZEXT416((uint)((float)local_860._0_4_ * fVar218 * 1.9073486e-06)
                                           ));
              auVar90 = vdivss_avx512f(ZEXT416((uint)fVar214),auVar84);
              auVar84 = vdpps_avx(local_7a0._0_16_,auVar204,0x7f);
              auVar82 = vfmadd213ss_fma(auVar82,ZEXT416((uint)fVar214),auVar236);
              auVar90 = vfmadd213ss_fma(ZEXT416((uint)(fVar220 + 1.0)),auVar90,auVar82);
              auVar82 = vdpps_avx(local_660._0_16_,local_810,0x7f);
              fVar138 = auVar83._0_4_ + auVar84._0_4_;
              auVar83 = vdpps_avx(local_7a0._0_16_,auVar89,0x7f);
              auVar87 = vmulss_avx512f(auVar87,auVar85);
              auVar85 = vmulss_avx512f(auVar85,auVar85);
              auVar84 = vdpps_avx(local_7a0._0_16_,local_660._0_16_,0x7f);
              auVar85 = vaddss_avx512f(auVar86,ZEXT416((uint)(auVar87._0_4_ * auVar85._0_4_)));
              auVar86 = vfnmadd231ss_avx512f(auVar83,local_8b0,ZEXT416((uint)fVar138));
              auVar87 = vfnmadd231ss_avx512f(auVar84,local_8b0,auVar82);
              auVar83 = vpermilps_avx(local_5a0._0_16_,0xff);
              fVar219 = fVar219 - auVar83._0_4_;
              auVar83 = vshufps_avx(auVar81,auVar81,0xff);
              auVar84 = vfmsub213ss_fma(auVar86,auVar85,auVar83);
              fVar220 = auVar87._0_4_ * auVar85._0_4_;
              auVar85 = vfmsub231ss_fma(ZEXT416((uint)(auVar82._0_4_ * auVar84._0_4_)),
                                        ZEXT416((uint)fVar138),ZEXT416((uint)fVar220));
              fVar222 = auVar85._0_4_;
              auVar216._0_4_ = fVar220 / fVar222;
              auVar216._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar212._0_4_ = auVar84._0_4_ / fVar222;
              auVar212._4_12_ = auVar84._4_12_;
              auVar84 = vmulss_avx512f(local_8b0,auVar216);
              auVar85 = vmulss_avx512f(local_8b0,auVar212);
              fVar220 = local_8a0._0_4_ - (auVar84._0_4_ - fVar219 * (auVar82._0_4_ / fVar222));
              auVar237 = ZEXT464((uint)fVar220);
              fVar138 = (float)local_860._0_4_ - (fVar219 * (fVar138 / fVar222) - auVar85._0_4_);
              uVar231 = 0;
              uVar242 = 0;
              uVar243 = 0;
              auVar82 = vandps_avx512vl(local_8b0,auVar233);
              if (auVar90._0_4_ <= auVar82._0_4_) {
                bVar6 = false;
                auVar246 = ZEXT864(0) << 0x20;
              }
              else {
                auVar84 = vfmadd231ss_fma(ZEXT416((uint)(auVar90._0_4_ + auVar236._0_4_)),local_640,
                                          ZEXT416(0x36000000));
                auVar82 = vandps_avx(auVar233,ZEXT416((uint)fVar219));
                auVar60._12_4_ = 0;
                auVar60._0_12_ = ZEXT812(0);
                auVar246 = ZEXT1264(ZEXT812(0)) << 0x20;
                if (auVar84._0_4_ <= auVar82._0_4_) {
                  bVar6 = false;
                }
                else {
                  fVar138 = fVar138 + (float)local_630._0_4_;
                  uVar231 = 0;
                  uVar242 = 0;
                  uVar243 = 0;
                  bVar6 = true;
                  if (((((ray->super_RayK<1>).org.field_0.m128[3] <= fVar138) &&
                       (fVar219 = (ray->super_RayK<1>).tfar, fVar138 <= fVar219)) &&
                      (0.0 <= fVar220)) && (fVar220 <= 1.0)) {
                    auVar82 = vrsqrt14ss_avx512f(auVar60 << 0x20,ZEXT416((uint)local_840._0_4_));
                    fVar222 = auVar82._0_4_;
                    pGVar4 = (context->scene->geometries).items[local_8b8].ptr;
                    if ((pGVar4->mask & (ray->super_RayK<1>).mask) != 0) {
                      fVar222 = fVar222 * 1.5 + local_840._0_4_ * -0.5 * fVar222 * fVar222 * fVar222
                      ;
                      auVar170._0_4_ = local_7a0._0_4_ * fVar222;
                      auVar170._4_4_ = local_7a0._4_4_ * fVar222;
                      auVar170._8_4_ = local_7a0._8_4_ * fVar222;
                      auVar170._12_4_ = local_7a0._12_4_ * fVar222;
                      auVar84 = vfmadd213ps_fma(auVar83,auVar170,auVar81);
                      auVar82 = vshufps_avx(auVar170,auVar170,0xc9);
                      auVar83 = vshufps_avx(auVar81,auVar81,0xc9);
                      auVar171._0_4_ = auVar170._0_4_ * auVar83._0_4_;
                      auVar171._4_4_ = auVar170._4_4_ * auVar83._4_4_;
                      auVar171._8_4_ = auVar170._8_4_ * auVar83._8_4_;
                      auVar171._12_4_ = auVar170._12_4_ * auVar83._12_4_;
                      auVar81 = vfmsub231ps_fma(auVar171,auVar81,auVar82);
                      auVar82 = vshufps_avx(auVar81,auVar81,0xc9);
                      auVar83 = vshufps_avx(auVar84,auVar84,0xc9);
                      auVar81 = vshufps_avx(auVar81,auVar81,0xd2);
                      auVar144._0_4_ = auVar84._0_4_ * auVar81._0_4_;
                      auVar144._4_4_ = auVar84._4_4_ * auVar81._4_4_;
                      auVar144._8_4_ = auVar84._8_4_ * auVar81._8_4_;
                      auVar144._12_4_ = auVar84._12_4_ * auVar81._12_4_;
                      auVar82 = vfmsub231ps_fma(auVar144,auVar82,auVar83);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = fVar138;
                        auVar83 = vshufps_avx(auVar82,auVar82,0xe9);
                        uVar13 = vmovlps_avx(auVar83);
                        *(undefined8 *)&(ray->Ng).field_0 = uVar13;
                        (ray->Ng).field_0.field_0.z = auVar82._0_4_;
                        ray->u = fVar220;
                        ray->v = 0.0;
                        ray->primID = (uint)local_868;
                        ray->geomID = (uint)local_8b8;
                        ray->instID[0] = context->user->instID[0];
                        ray->instPrimID[0] = context->user->instPrimID[0];
                      }
                      else {
                        auVar83 = vshufps_avx(auVar82,auVar82,0xe9);
                        local_750 = vmovlps_avx(auVar83);
                        local_748 = auVar82._0_4_;
                        local_744 = fVar220;
                        local_740 = 0;
                        local_73c = (uint)local_868;
                        local_738 = (uint)local_8b8;
                        local_734 = context->user->instID[0];
                        local_730 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = fVar138;
                        local_8bc = -1;
                        local_7e0.valid = &local_8bc;
                        local_7e0.geometryUserPtr = pGVar4->userPtr;
                        local_7e0.context = context->user;
                        local_7e0.ray = (RTCRayN *)ray;
                        local_7e0.hit = (RTCHitN *)&local_750;
                        local_7e0.N = 1;
                        local_8a0._0_16_ = ZEXT416((uint)fVar220);
                        local_860._0_16_ = ZEXT416((uint)fVar138);
                        local_840._0_4_ = fVar219;
                        if (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01da6bb8:
                          p_Var5 = context->args->filter;
                          if (p_Var5 != (RTCFilterFunctionN)0x0) {
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar4->field_8).field_0x2 & 0x40) != 0)) {
                              auVar234 = ZEXT1664(auVar234._0_16_);
                              auVar245 = ZEXT1664(auVar245._0_16_);
                              (*p_Var5)(&local_7e0);
                              auVar237 = ZEXT1664(local_8a0._0_16_);
                              auVar246 = ZEXT1664(ZEXT816(0) << 0x40);
                              fVar219 = (float)local_840._0_4_;
                              fVar138 = (float)local_860._0_4_;
                              uVar231 = local_860._4_4_;
                              uVar242 = local_860._8_4_;
                              uVar243 = local_860._12_4_;
                            }
                            if (*local_7e0.valid == 0) goto LAB_01da6c68;
                          }
                          (((Vec3f *)((long)local_7e0.ray + 0x30))->field_0).components[0] =
                               *(float *)local_7e0.hit;
                          (((Vec3f *)((long)local_7e0.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_7e0.hit + 4);
                          (((Vec3f *)((long)local_7e0.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_7e0.hit + 8);
                          *(float *)((long)local_7e0.ray + 0x3c) = *(float *)(local_7e0.hit + 0xc);
                          *(float *)((long)local_7e0.ray + 0x40) = *(float *)(local_7e0.hit + 0x10);
                          *(float *)((long)local_7e0.ray + 0x44) = *(float *)(local_7e0.hit + 0x14);
                          *(float *)((long)local_7e0.ray + 0x48) = *(float *)(local_7e0.hit + 0x18);
                          *(float *)((long)local_7e0.ray + 0x4c) = *(float *)(local_7e0.hit + 0x1c);
                          *(float *)((long)local_7e0.ray + 0x50) = *(float *)(local_7e0.hit + 0x20);
                        }
                        else {
                          auVar234 = ZEXT1664(auVar233);
                          auVar245 = ZEXT1664(local_7a0._0_16_);
                          (*pGVar4->intersectionFilterN)(&local_7e0);
                          auVar237 = ZEXT1664(local_8a0._0_16_);
                          auVar246 = ZEXT1664(ZEXT816(0) << 0x40);
                          fVar219 = (float)local_840._0_4_;
                          fVar138 = (float)local_860._0_4_;
                          uVar231 = local_860._4_4_;
                          uVar242 = local_860._8_4_;
                          uVar243 = local_860._12_4_;
                          if (*local_7e0.valid != 0) goto LAB_01da6bb8;
LAB_01da6c68:
                          (ray->super_RayK<1>).tfar = fVar219;
                        }
                      }
                    }
                  }
                }
              }
              bVar78 = lVar77 != 0;
              lVar77 = lVar77 + -1;
            } while ((!bVar6) && (bVar78));
            auVar65._4_4_ = fStack_4fc;
            auVar65._0_4_ = local_500;
            auVar65._8_4_ = fStack_4f8;
            auVar65._12_4_ = fStack_4f4;
            auVar65._16_4_ = fStack_4f0;
            auVar65._20_4_ = fStack_4ec;
            auVar65._24_4_ = fStack_4e8;
            auVar65._28_4_ = fStack_4e4;
            fVar138 = (ray->super_RayK<1>).tfar;
            auVar34._4_4_ = fVar138;
            auVar34._0_4_ = fVar138;
            auVar34._8_4_ = fVar138;
            auVar34._12_4_ = fVar138;
            auVar34._16_4_ = fVar138;
            auVar34._20_4_ = fVar138;
            auVar34._24_4_ = fVar138;
            auVar34._28_4_ = fVar138;
            uVar13 = vcmpps_avx512vl(auVar65,auVar34,2);
            bVar75 = ~('\x01' << ((byte)iVar16 & 0x1f)) & bVar75 & (byte)uVar13;
          } while (bVar75 != 0);
        }
        uVar14 = vpcmpd_avx512vl(local_4a0,_local_580,1);
        uVar15 = vpcmpd_avx512vl(local_4a0,local_3e0,1);
        auVar174._0_4_ = (float)local_680._0_4_ + (float)local_460._0_4_;
        auVar174._4_4_ = (float)local_680._4_4_ + (float)local_460._4_4_;
        auVar174._8_4_ = fStack_678 + fStack_458;
        auVar174._12_4_ = fStack_674 + fStack_454;
        auVar174._16_4_ = fStack_670 + fStack_450;
        auVar174._20_4_ = fStack_66c + fStack_44c;
        auVar174._24_4_ = fStack_668 + fStack_448;
        auVar174._28_4_ = fStack_664 + fStack_444;
        fVar214 = (ray->super_RayK<1>).tfar;
        auVar189._4_4_ = fVar214;
        auVar189._0_4_ = fVar214;
        auVar189._8_4_ = fVar214;
        auVar189._12_4_ = fVar214;
        auVar189._16_4_ = fVar214;
        auVar189._20_4_ = fVar214;
        auVar189._24_4_ = fVar214;
        auVar189._28_4_ = fVar214;
        uVar13 = vcmpps_avx512vl(auVar174,auVar189,2);
        bVar75 = (byte)local_7a8 & (byte)uVar15 & (byte)uVar13;
        auVar200._0_4_ = (float)local_680._0_4_ + (float)local_420._0_4_;
        auVar200._4_4_ = (float)local_680._4_4_ + (float)local_420._4_4_;
        auVar200._8_4_ = fStack_678 + fStack_418;
        auVar200._12_4_ = fStack_674 + fStack_414;
        auVar200._16_4_ = fStack_670 + fStack_410;
        auVar200._20_4_ = fStack_66c + fStack_40c;
        auVar200._24_4_ = fStack_668 + fStack_408;
        auVar200._28_4_ = fStack_664 + fStack_404;
        uVar13 = vcmpps_avx512vl(auVar200,auVar189,2);
        bVar71 = bVar71 & (byte)uVar14 & (byte)uVar13 | bVar75;
        prim = local_718;
        if (bVar71 == 0) {
          auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar251 = ZEXT3264(auVar96);
        }
        else {
          uVar79 = local_7e8 & 0xffffffff;
          abStack_180[uVar79 * 0x60] = bVar71;
          bVar6 = (bool)(bVar75 >> 1 & 1);
          bVar78 = (bool)(bVar75 >> 2 & 1);
          bVar7 = (bool)(bVar75 >> 3 & 1);
          bVar8 = (bool)(bVar75 >> 4 & 1);
          bVar9 = (bool)(bVar75 >> 5 & 1);
          bVar10 = (bool)(bVar75 >> 6 & 1);
          auStack_160[uVar79 * 0x18] =
               (uint)(bVar75 & 1) * local_460._0_4_ | (uint)!(bool)(bVar75 & 1) * local_420._0_4_;
          auStack_160[uVar79 * 0x18 + 1] =
               (uint)bVar6 * local_460._4_4_ | (uint)!bVar6 * local_420._4_4_;
          auStack_160[uVar79 * 0x18 + 2] =
               (uint)bVar78 * (int)fStack_458 | (uint)!bVar78 * (int)fStack_418;
          auStack_160[uVar79 * 0x18 + 3] =
               (uint)bVar7 * (int)fStack_454 | (uint)!bVar7 * (int)fStack_414;
          auStack_160[uVar79 * 0x18 + 4] =
               (uint)bVar8 * (int)fStack_450 | (uint)!bVar8 * (int)fStack_410;
          afStack_140[uVar79 * 0x18 + -3] =
               (float)((uint)bVar9 * (int)fStack_44c | (uint)!bVar9 * (int)fStack_40c);
          afStack_140[uVar79 * 0x18 + -2] =
               (float)((uint)bVar10 * (int)fStack_448 | (uint)!bVar10 * (int)fStack_408);
          afStack_140[uVar79 * 0x18 + -1] =
               (float)((uint)(bVar75 >> 7) * (int)fStack_444 |
                      (uint)!(bool)(bVar75 >> 7) * (int)fStack_404);
          uVar13 = vmovlps_avx(local_760);
          *(undefined8 *)(afStack_140 + uVar79 * 0x18) = uVar13;
          auStack_138[uVar79 * 0x18] = (int)local_710 + 1;
          local_7e8 = (ulong)((int)local_7e8 + 1);
          auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar251 = ZEXT3264(auVar96);
        }
      }
    }
    auVar210 = ZEXT1664(local_760);
    fVar214 = (ray->super_RayK<1>).tfar;
    auVar147._4_4_ = fVar214;
    auVar147._0_4_ = fVar214;
    auVar147._8_4_ = fVar214;
    auVar147._12_4_ = fVar214;
    auVar147._16_4_ = fVar214;
    auVar147._20_4_ = fVar214;
    auVar147._24_4_ = fVar214;
    auVar147._28_4_ = fVar214;
    local_7e8 = local_7e8 & 0xffffffff;
    do {
      if ((int)local_7e8 == 0) {
        fVar214 = (ray->super_RayK<1>).tfar;
        auVar35._4_4_ = fVar214;
        auVar35._0_4_ = fVar214;
        auVar35._8_4_ = fVar214;
        auVar35._12_4_ = fVar214;
        auVar35._16_4_ = fVar214;
        auVar35._20_4_ = fVar214;
        auVar35._24_4_ = fVar214;
        auVar35._28_4_ = fVar214;
        uVar13 = vcmpps_avx512vl(local_3c0,auVar35,2);
        uVar80 = (uint)local_708 & (uint)uVar13;
        local_708 = (ulong)uVar80;
        if (uVar80 == 0) {
          return;
        }
        goto LAB_01da46c8;
      }
      uVar79 = (ulong)((int)local_7e8 - 1);
      auVar94 = *(undefined1 (*) [32])(auStack_160 + uVar79 * 0x18);
      auVar186._0_4_ = (float)local_680._0_4_ + auVar94._0_4_;
      auVar186._4_4_ = (float)local_680._4_4_ + auVar94._4_4_;
      auVar186._8_4_ = fStack_678 + auVar94._8_4_;
      auVar186._12_4_ = fStack_674 + auVar94._12_4_;
      auVar186._16_4_ = fStack_670 + auVar94._16_4_;
      auVar186._20_4_ = fStack_66c + auVar94._20_4_;
      auVar186._24_4_ = fStack_668 + auVar94._24_4_;
      auVar186._28_4_ = fStack_664 + auVar94._28_4_;
      uVar13 = vcmpps_avx512vl(auVar186,auVar147,2);
      uVar80 = (uint)uVar13 & (uint)abStack_180[uVar79 * 0x60];
      bVar71 = (byte)uVar80;
      if (uVar80 != 0) {
        auVar187._8_4_ = 0x7f800000;
        auVar187._0_8_ = 0x7f8000007f800000;
        auVar187._12_4_ = 0x7f800000;
        auVar187._16_4_ = 0x7f800000;
        auVar187._20_4_ = 0x7f800000;
        auVar187._24_4_ = 0x7f800000;
        auVar187._28_4_ = 0x7f800000;
        auVar96 = vblendmps_avx512vl(auVar187,auVar94);
        auVar128._0_4_ =
             (uint)(bVar71 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar71 & 1) * (int)auVar94._0_4_;
        bVar6 = (bool)((byte)(uVar80 >> 1) & 1);
        auVar128._4_4_ = (uint)bVar6 * auVar96._4_4_ | (uint)!bVar6 * (int)auVar94._4_4_;
        bVar6 = (bool)((byte)(uVar80 >> 2) & 1);
        auVar128._8_4_ = (uint)bVar6 * auVar96._8_4_ | (uint)!bVar6 * (int)auVar94._8_4_;
        bVar6 = (bool)((byte)(uVar80 >> 3) & 1);
        auVar128._12_4_ = (uint)bVar6 * auVar96._12_4_ | (uint)!bVar6 * (int)auVar94._12_4_;
        bVar6 = (bool)((byte)(uVar80 >> 4) & 1);
        auVar128._16_4_ = (uint)bVar6 * auVar96._16_4_ | (uint)!bVar6 * (int)auVar94._16_4_;
        bVar6 = (bool)((byte)(uVar80 >> 5) & 1);
        auVar128._20_4_ = (uint)bVar6 * auVar96._20_4_ | (uint)!bVar6 * (int)auVar94._20_4_;
        bVar6 = (bool)((byte)(uVar80 >> 6) & 1);
        auVar128._24_4_ = (uint)bVar6 * auVar96._24_4_ | (uint)!bVar6 * (int)auVar94._24_4_;
        auVar128._28_4_ =
             (uVar80 >> 7) * auVar96._28_4_ | (uint)!SUB41(uVar80 >> 7,0) * (int)auVar94._28_4_;
        auVar96 = vshufps_avx(auVar128,auVar128,0xb1);
        auVar96 = vminps_avx(auVar128,auVar96);
        auVar94 = vshufpd_avx(auVar96,auVar96,5);
        auVar96 = vminps_avx(auVar96,auVar94);
        auVar94 = vpermpd_avx2(auVar96,0x4e);
        auVar96 = vminps_avx(auVar96,auVar94);
        uVar13 = vcmpps_avx512vl(auVar128,auVar96,0);
        bVar75 = (byte)uVar13 & bVar71;
        if (bVar75 != 0) {
          uVar80 = (uint)bVar75;
        }
        fVar214 = afStack_140[uVar79 * 0x18 + 1];
        uVar131 = 0;
        for (; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x80000000) {
          uVar131 = uVar131 + 1;
        }
        local_710 = (ulong)auStack_138[uVar79 * 0x18];
        bVar75 = ~('\x01' << ((byte)uVar131 & 0x1f)) & bVar71;
        abStack_180[uVar79 * 0x60] = bVar75;
        auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar251 = ZEXT3264(auVar96);
        uVar73 = uVar79;
        if (bVar75 != 0) {
          uVar73 = local_7e8;
        }
        fVar138 = afStack_140[uVar79 * 0x18];
        auVar188._4_4_ = fVar138;
        auVar188._0_4_ = fVar138;
        auVar188._8_4_ = fVar138;
        auVar188._12_4_ = fVar138;
        auVar188._16_4_ = fVar138;
        auVar188._20_4_ = fVar138;
        auVar188._24_4_ = fVar138;
        auVar188._28_4_ = fVar138;
        fVar214 = fVar214 - fVar138;
        auVar173._4_4_ = fVar214;
        auVar173._0_4_ = fVar214;
        auVar173._8_4_ = fVar214;
        auVar173._12_4_ = fVar214;
        auVar173._16_4_ = fVar214;
        auVar173._20_4_ = fVar214;
        auVar173._24_4_ = fVar214;
        auVar173._28_4_ = fVar214;
        auVar82 = vfmadd132ps_fma(auVar173,auVar188,_DAT_02020f20);
        _local_460 = ZEXT1632(auVar82);
        auVar210 = ZEXT864(*(ulong *)(local_460 + (ulong)uVar131 * 4));
        uVar79 = uVar73;
      }
      local_7e8 = uVar79;
    } while (bVar71 == 0);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }